

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  int iVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  uint uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [12];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar94 [32];
  undefined1 auVar95 [28];
  uint uVar96;
  uint uVar97;
  uint uVar98;
  ulong uVar99;
  uint uVar100;
  long lVar101;
  long lVar102;
  ulong uVar103;
  Geometry *pGVar104;
  undefined4 uVar105;
  undefined8 uVar106;
  float fVar120;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar119;
  float fVar121;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar190;
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  float fVar211;
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar222 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined4 uVar215;
  float fVar216;
  float fVar219;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7f4;
  RayHit *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  ulong local_788;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  Primitive *local_740;
  Precalculations *local_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined8 local_690;
  undefined4 local_688;
  float local_684;
  undefined4 local_680;
  undefined4 local_67c;
  undefined4 local_678;
  uint local_674;
  uint local_670;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [2] [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  int iStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_738 = pre;
  PVar14 = prim[1];
  uVar99 = (ulong)(byte)PVar14;
  lVar24 = uVar99 * 0x25;
  fVar141 = *(float *)(prim + lVar24 + 0x12);
  auVar166 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar24 + 6));
  auVar142._0_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar142._4_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar142._8_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar142._12_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar107._0_4_ = fVar141 * auVar166._0_4_;
  auVar107._4_4_ = fVar141 * auVar166._4_4_;
  auVar107._8_4_ = fVar141 * auVar166._8_4_;
  auVar107._12_4_ = fVar141 * auVar166._12_4_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar99 * 4 + 6);
  auVar134 = vpmovsxbd_avx2(auVar166);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar99 * 5 + 6);
  auVar184 = vpmovsxbd_avx2(auVar6);
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar99 * 6 + 6);
  auVar114 = vpmovsxbd_avx2(auVar7);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar99 * 0xf + 6);
  auVar131 = vpmovsxbd_avx2(auVar8);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar202 = vpmovsxbd_avx2(auVar9);
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar99 + 6);
  auVar195 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar99 * 0x1a + 6);
  auVar116 = vpmovsxbd_avx2(auVar11);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar99 * 0x1b + 6);
  auVar22 = vpmovsxbd_avx2(auVar12);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar99 * 0x1c + 6);
  auVar222 = vpmovsxbd_avx2(auVar13);
  auVar19 = vcvtdq2ps_avx(auVar22);
  auVar222 = vcvtdq2ps_avx(auVar222);
  auVar212._4_4_ = auVar142._0_4_;
  auVar212._0_4_ = auVar142._0_4_;
  auVar212._8_4_ = auVar142._0_4_;
  auVar212._12_4_ = auVar142._0_4_;
  auVar212._16_4_ = auVar142._0_4_;
  auVar212._20_4_ = auVar142._0_4_;
  auVar212._24_4_ = auVar142._0_4_;
  auVar212._28_4_ = auVar142._0_4_;
  auVar166 = vmovshdup_avx(auVar142);
  uVar106 = auVar166._0_8_;
  auVar220._8_8_ = uVar106;
  auVar220._0_8_ = uVar106;
  auVar220._16_8_ = uVar106;
  auVar220._24_8_ = uVar106;
  auVar166 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar141 = auVar166._0_4_;
  auVar210._0_4_ = fVar141 * auVar114._0_4_;
  fVar140 = auVar166._4_4_;
  auVar210._4_4_ = fVar140 * auVar114._4_4_;
  auVar210._8_4_ = fVar141 * auVar114._8_4_;
  auVar210._12_4_ = fVar140 * auVar114._12_4_;
  auVar210._16_4_ = fVar141 * auVar114._16_4_;
  auVar210._20_4_ = fVar140 * auVar114._20_4_;
  auVar210._28_36_ = in_ZMM10._28_36_;
  auVar210._24_4_ = fVar141 * auVar114._24_4_;
  auVar20._4_4_ = auVar195._4_4_ * fVar140;
  auVar20._0_4_ = auVar195._0_4_ * fVar141;
  auVar20._8_4_ = auVar195._8_4_ * fVar141;
  auVar20._12_4_ = auVar195._12_4_ * fVar140;
  auVar20._16_4_ = auVar195._16_4_ * fVar141;
  auVar20._20_4_ = auVar195._20_4_ * fVar140;
  auVar20._24_4_ = auVar195._24_4_ * fVar141;
  auVar20._28_4_ = auVar22._28_4_;
  auVar191._0_4_ = auVar222._0_4_ * fVar141;
  auVar191._4_4_ = auVar222._4_4_ * fVar140;
  auVar191._8_4_ = auVar222._8_4_ * fVar141;
  auVar191._12_4_ = auVar222._12_4_ * fVar140;
  auVar191._16_4_ = auVar222._16_4_ * fVar141;
  auVar191._20_4_ = auVar222._20_4_ * fVar140;
  auVar191._24_4_ = auVar222._24_4_ * fVar141;
  auVar191._28_4_ = 0;
  auVar166 = vfmadd231ps_fma(auVar210._0_32_,auVar220,auVar184);
  auVar6 = vfmadd231ps_fma(auVar20,auVar220,auVar202);
  auVar7 = vfmadd231ps_fma(auVar191,auVar19,auVar220);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar212,auVar134);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar212,auVar131);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar116,auVar212);
  auVar213._4_4_ = auVar107._0_4_;
  auVar213._0_4_ = auVar107._0_4_;
  auVar213._8_4_ = auVar107._0_4_;
  auVar213._12_4_ = auVar107._0_4_;
  auVar213._16_4_ = auVar107._0_4_;
  auVar213._20_4_ = auVar107._0_4_;
  auVar213._24_4_ = auVar107._0_4_;
  auVar213._28_4_ = auVar107._0_4_;
  auVar166 = vmovshdup_avx(auVar107);
  uVar106 = auVar166._0_8_;
  auVar221._8_8_ = uVar106;
  auVar221._0_8_ = uVar106;
  auVar221._16_8_ = uVar106;
  auVar221._24_8_ = uVar106;
  auVar166 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar141 = auVar166._0_4_;
  auVar153._0_4_ = fVar141 * auVar114._0_4_;
  fVar140 = auVar166._4_4_;
  auVar153._4_4_ = fVar140 * auVar114._4_4_;
  auVar153._8_4_ = fVar141 * auVar114._8_4_;
  auVar153._12_4_ = fVar140 * auVar114._12_4_;
  auVar153._16_4_ = fVar141 * auVar114._16_4_;
  auVar153._20_4_ = fVar140 * auVar114._20_4_;
  auVar153._24_4_ = fVar141 * auVar114._24_4_;
  auVar153._28_4_ = 0;
  auVar22._4_4_ = auVar195._4_4_ * fVar140;
  auVar22._0_4_ = auVar195._0_4_ * fVar141;
  auVar22._8_4_ = auVar195._8_4_ * fVar141;
  auVar22._12_4_ = auVar195._12_4_ * fVar140;
  auVar22._16_4_ = auVar195._16_4_ * fVar141;
  auVar22._20_4_ = auVar195._20_4_ * fVar140;
  auVar22._24_4_ = auVar195._24_4_ * fVar141;
  auVar22._28_4_ = auVar114._28_4_;
  auVar114._4_4_ = auVar222._4_4_ * fVar140;
  auVar114._0_4_ = auVar222._0_4_ * fVar141;
  auVar114._8_4_ = auVar222._8_4_ * fVar141;
  auVar114._12_4_ = auVar222._12_4_ * fVar140;
  auVar114._16_4_ = auVar222._16_4_ * fVar141;
  auVar114._20_4_ = auVar222._20_4_ * fVar140;
  auVar114._24_4_ = auVar222._24_4_ * fVar141;
  auVar114._28_4_ = fVar140;
  auVar166 = vfmadd231ps_fma(auVar153,auVar221,auVar184);
  auVar9 = vfmadd231ps_fma(auVar22,auVar221,auVar202);
  auVar10 = vfmadd231ps_fma(auVar114,auVar221,auVar19);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar213,auVar134);
  local_180._8_4_ = 0x7fffffff;
  local_180._0_8_ = 0x7fffffff7fffffff;
  local_180._12_4_ = 0x7fffffff;
  local_180._16_4_ = 0x7fffffff;
  local_180._20_4_ = 0x7fffffff;
  local_180._24_4_ = 0x7fffffff;
  local_180._28_4_ = 0x7fffffff;
  auVar159._8_4_ = 0x219392ef;
  auVar159._0_8_ = 0x219392ef219392ef;
  auVar159._12_4_ = 0x219392ef;
  auVar159._16_4_ = 0x219392ef;
  auVar159._20_4_ = 0x219392ef;
  auVar159._24_4_ = 0x219392ef;
  auVar159._28_4_ = 0x219392ef;
  auVar134 = vandps_avx(ZEXT1632(auVar8),local_180);
  auVar134 = vcmpps_avx(auVar134,auVar159,1);
  auVar184 = vblendvps_avx(ZEXT1632(auVar8),auVar159,auVar134);
  auVar134 = vandps_avx(ZEXT1632(auVar6),local_180);
  auVar134 = vcmpps_avx(auVar134,auVar159,1);
  auVar114 = vblendvps_avx(ZEXT1632(auVar6),auVar159,auVar134);
  auVar134 = vandps_avx(ZEXT1632(auVar7),local_180);
  auVar134 = vcmpps_avx(auVar134,auVar159,1);
  auVar134 = vblendvps_avx(ZEXT1632(auVar7),auVar159,auVar134);
  auVar142 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar213,auVar131);
  auVar131 = vrcpps_avx(auVar184);
  auVar25 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar213,auVar116);
  auVar192._8_4_ = 0x3f800000;
  auVar192._0_8_ = 0x3f8000003f800000;
  auVar192._12_4_ = 0x3f800000;
  auVar192._16_4_ = 0x3f800000;
  auVar192._20_4_ = 0x3f800000;
  auVar192._24_4_ = 0x3f800000;
  auVar192._28_4_ = 0x3f800000;
  auVar166 = vfnmadd213ps_fma(auVar184,auVar131,auVar192);
  auVar166 = vfmadd132ps_fma(ZEXT1632(auVar166),auVar131,auVar131);
  auVar184 = vrcpps_avx(auVar114);
  auVar6 = vfnmadd213ps_fma(auVar114,auVar184,auVar192);
  auVar114 = vrcpps_avx(auVar134);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar184,auVar184);
  auVar7 = vfnmadd213ps_fma(auVar134,auVar114,auVar192);
  auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar114,auVar114);
  fVar141 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 7 + 6));
  auVar183._4_4_ = fVar141;
  auVar183._0_4_ = fVar141;
  auVar183._8_4_ = fVar141;
  auVar183._12_4_ = fVar141;
  auVar183._16_4_ = fVar141;
  auVar183._20_4_ = fVar141;
  auVar183._24_4_ = fVar141;
  auVar183._28_4_ = fVar141;
  auVar184 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0xb + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar184 = vsubps_avx(auVar184,auVar134);
  auVar8 = vfmadd213ps_fma(auVar184,auVar183,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 9 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar184 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0xd + 6));
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar184 = vsubps_avx(auVar184,auVar134);
  auVar9 = vfmadd213ps_fma(auVar184,auVar183,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x12 + 6));
  uVar103 = (ulong)(uint)((int)(uVar99 * 5) << 2);
  auVar184 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 2 + uVar103 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar184 = vsubps_avx(auVar184,auVar134);
  auVar10 = vfmadd213ps_fma(auVar184,auVar183,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 + 6));
  auVar184 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x18 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar184 = vsubps_avx(auVar184,auVar134);
  auVar11 = vfmadd213ps_fma(auVar184,auVar183,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x1d + 6));
  auVar184 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 + (ulong)(byte)PVar14 * 0x20 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar184 = vsubps_avx(auVar184,auVar134);
  auVar12 = vfmadd213ps_fma(auVar184,auVar183,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar14 * 0x20 - uVar99) + 6)
                           );
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar184 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x23 + 6));
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar184 = vsubps_avx(auVar184,auVar134);
  auVar13 = vfmadd213ps_fma(auVar184,auVar183,auVar134);
  auVar134 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar107));
  auVar131._4_4_ = auVar166._4_4_ * auVar134._4_4_;
  auVar131._0_4_ = auVar166._0_4_ * auVar134._0_4_;
  auVar131._8_4_ = auVar166._8_4_ * auVar134._8_4_;
  auVar131._12_4_ = auVar166._12_4_ * auVar134._12_4_;
  auVar131._16_4_ = auVar134._16_4_ * 0.0;
  auVar131._20_4_ = auVar134._20_4_ * 0.0;
  auVar131._24_4_ = auVar134._24_4_ * 0.0;
  auVar131._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar107));
  auVar202._4_4_ = auVar166._4_4_ * auVar134._4_4_;
  auVar202._0_4_ = auVar166._0_4_ * auVar134._0_4_;
  auVar202._8_4_ = auVar166._8_4_ * auVar134._8_4_;
  auVar202._12_4_ = auVar166._12_4_ * auVar134._12_4_;
  auVar202._16_4_ = auVar134._16_4_ * 0.0;
  auVar202._20_4_ = auVar134._20_4_ * 0.0;
  auVar202._24_4_ = auVar134._24_4_ * 0.0;
  auVar202._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar142));
  auVar195._4_4_ = auVar6._4_4_ * auVar134._4_4_;
  auVar195._0_4_ = auVar6._0_4_ * auVar134._0_4_;
  auVar195._8_4_ = auVar6._8_4_ * auVar134._8_4_;
  auVar195._12_4_ = auVar6._12_4_ * auVar134._12_4_;
  auVar195._16_4_ = auVar134._16_4_ * 0.0;
  auVar195._20_4_ = auVar134._20_4_ * 0.0;
  auVar195._24_4_ = auVar134._24_4_ * 0.0;
  auVar195._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar142));
  auVar116._4_4_ = auVar6._4_4_ * auVar134._4_4_;
  auVar116._0_4_ = auVar6._0_4_ * auVar134._0_4_;
  auVar116._8_4_ = auVar6._8_4_ * auVar134._8_4_;
  auVar116._12_4_ = auVar6._12_4_ * auVar134._12_4_;
  auVar116._16_4_ = auVar134._16_4_ * 0.0;
  auVar116._20_4_ = auVar134._20_4_ * 0.0;
  auVar116._24_4_ = auVar134._24_4_ * 0.0;
  auVar116._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar25));
  auVar19._4_4_ = auVar7._4_4_ * auVar134._4_4_;
  auVar19._0_4_ = auVar7._0_4_ * auVar134._0_4_;
  auVar19._8_4_ = auVar7._8_4_ * auVar134._8_4_;
  auVar19._12_4_ = auVar7._12_4_ * auVar134._12_4_;
  auVar19._16_4_ = auVar134._16_4_ * 0.0;
  auVar19._20_4_ = auVar134._20_4_ * 0.0;
  auVar19._24_4_ = auVar134._24_4_ * 0.0;
  auVar19._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar25));
  auVar222._4_4_ = auVar7._4_4_ * auVar134._4_4_;
  auVar222._0_4_ = auVar7._0_4_ * auVar134._0_4_;
  auVar222._8_4_ = auVar7._8_4_ * auVar134._8_4_;
  auVar222._12_4_ = auVar7._12_4_ * auVar134._12_4_;
  auVar222._16_4_ = auVar134._16_4_ * 0.0;
  auVar222._20_4_ = auVar134._20_4_ * 0.0;
  auVar222._24_4_ = auVar134._24_4_ * 0.0;
  auVar222._28_4_ = auVar134._28_4_;
  auVar134 = vpminsd_avx2(auVar131,auVar202);
  auVar184 = vpminsd_avx2(auVar195,auVar116);
  auVar134 = vmaxps_avx(auVar134,auVar184);
  auVar184 = vpminsd_avx2(auVar19,auVar222);
  uVar105 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar193._4_4_ = uVar105;
  auVar193._0_4_ = uVar105;
  auVar193._8_4_ = uVar105;
  auVar193._12_4_ = uVar105;
  auVar193._16_4_ = uVar105;
  auVar193._20_4_ = uVar105;
  auVar193._24_4_ = uVar105;
  auVar193._28_4_ = uVar105;
  auVar184 = vmaxps_avx(auVar184,auVar193);
  auVar134 = vmaxps_avx(auVar134,auVar184);
  local_80._4_4_ = auVar134._4_4_ * 0.99999964;
  local_80._0_4_ = auVar134._0_4_ * 0.99999964;
  local_80._8_4_ = auVar134._8_4_ * 0.99999964;
  local_80._12_4_ = auVar134._12_4_ * 0.99999964;
  local_80._16_4_ = auVar134._16_4_ * 0.99999964;
  local_80._20_4_ = auVar134._20_4_ * 0.99999964;
  local_80._24_4_ = auVar134._24_4_ * 0.99999964;
  local_80._28_4_ = auVar134._28_4_;
  auVar134 = vpmaxsd_avx2(auVar131,auVar202);
  auVar184 = vpmaxsd_avx2(auVar195,auVar116);
  auVar134 = vminps_avx(auVar134,auVar184);
  auVar184 = vpmaxsd_avx2(auVar19,auVar222);
  fVar141 = (ray->super_RayK<1>).tfar;
  auVar154._4_4_ = fVar141;
  auVar154._0_4_ = fVar141;
  auVar154._8_4_ = fVar141;
  auVar154._12_4_ = fVar141;
  auVar154._16_4_ = fVar141;
  auVar154._20_4_ = fVar141;
  auVar154._24_4_ = fVar141;
  auVar154._28_4_ = fVar141;
  auVar184 = vminps_avx(auVar184,auVar154);
  auVar134 = vminps_avx(auVar134,auVar184);
  auVar21._4_4_ = auVar134._4_4_ * 1.0000004;
  auVar21._0_4_ = auVar134._0_4_ * 1.0000004;
  auVar21._8_4_ = auVar134._8_4_ * 1.0000004;
  auVar21._12_4_ = auVar134._12_4_ * 1.0000004;
  auVar21._16_4_ = auVar134._16_4_ * 1.0000004;
  auVar21._20_4_ = auVar134._20_4_ * 1.0000004;
  auVar21._24_4_ = auVar134._24_4_ * 1.0000004;
  auVar21._28_4_ = auVar134._28_4_;
  auVar134._1_3_ = 0;
  auVar134[0] = PVar14;
  auVar134[4] = PVar14;
  auVar134._5_3_ = 0;
  auVar134[8] = PVar14;
  auVar134._9_3_ = 0;
  auVar134[0xc] = PVar14;
  auVar134._13_3_ = 0;
  auVar134[0x10] = PVar14;
  auVar134._17_3_ = 0;
  auVar134[0x14] = PVar14;
  auVar134._21_3_ = 0;
  auVar134[0x18] = PVar14;
  auVar134._25_3_ = 0;
  auVar134[0x1c] = PVar14;
  auVar134._29_3_ = 0;
  auVar184 = vpcmpgtd_avx2(auVar134,_DAT_01fe9900);
  auVar134 = vcmpps_avx(local_80,auVar21,2);
  auVar134 = vandps_avx(auVar134,auVar184);
  uVar96 = vmovmskps_avx(auVar134);
  if (uVar96 != 0) {
    uVar96 = uVar96 & 0xff;
    local_580[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_580[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_580[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_580[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_2d0 = 0x7fffffff;
    uStack_2cc = 0x7fffffff;
    uStack_2c8 = 0x7fffffff;
    uStack_2c4 = 0x7fffffff;
    local_740 = prim;
    local_7f0 = ray;
    do {
      auVar134 = local_500;
      lVar24 = 0;
      for (uVar99 = (ulong)uVar96; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar100 = *(uint *)(prim + 2);
      uVar98 = *(uint *)(prim + lVar24 * 4 + 6);
      local_7e8 = (ulong)uVar100;
      pGVar104 = (context->scene->geometries).items[uVar100].ptr;
      local_788 = (ulong)uVar98;
      uVar99 = (ulong)*(uint *)(*(long *)&pGVar104->field_0x58 +
                               (ulong)uVar98 *
                               pGVar104[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar141 = (pGVar104->time_range).lower;
      fVar141 = pGVar104->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar141) /
                ((pGVar104->time_range).upper - fVar141));
      auVar166 = vroundss_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),9);
      auVar166 = vminss_avx(auVar166,ZEXT416((uint)(pGVar104->fnumTimeSegments + -1.0)));
      auVar166 = vmaxss_avx(ZEXT816(0) << 0x20,auVar166);
      fVar141 = fVar141 - auVar166._0_4_;
      _Var16 = pGVar104[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar102 = (long)(int)auVar166._0_4_ * 0x38;
      lVar24 = *(long *)(_Var16 + 0x10 + lVar102);
      lVar101 = *(long *)(_Var16 + 0x38 + lVar102);
      lVar17 = *(long *)(_Var16 + 0x48 + lVar102);
      pfVar1 = (float *)(lVar101 + uVar99 * lVar17);
      auVar163._0_4_ = fVar141 * *pfVar1;
      auVar163._4_4_ = fVar141 * pfVar1[1];
      auVar163._8_4_ = fVar141 * pfVar1[2];
      auVar163._12_4_ = fVar141 * pfVar1[3];
      pfVar1 = (float *)(lVar101 + (uVar99 + 1) * lVar17);
      auVar203._0_4_ = fVar141 * *pfVar1;
      auVar203._4_4_ = fVar141 * pfVar1[1];
      auVar203._8_4_ = fVar141 * pfVar1[2];
      auVar203._12_4_ = fVar141 * pfVar1[3];
      pfVar1 = (float *)(lVar101 + (uVar99 + 2) * lVar17);
      auVar143._0_4_ = fVar141 * *pfVar1;
      auVar143._4_4_ = fVar141 * pfVar1[1];
      auVar143._8_4_ = fVar141 * pfVar1[2];
      auVar143._12_4_ = fVar141 * pfVar1[3];
      pfVar1 = (float *)(lVar101 + lVar17 * (uVar99 + 3));
      auVar158._0_4_ = fVar141 * *pfVar1;
      auVar158._4_4_ = fVar141 * pfVar1[1];
      auVar158._8_4_ = fVar141 * pfVar1[2];
      auVar158._12_4_ = fVar141 * pfVar1[3];
      lVar101 = *(long *)(_Var16 + lVar102);
      fVar141 = 1.0 - fVar141;
      auVar108._4_4_ = fVar141;
      auVar108._0_4_ = fVar141;
      auVar108._8_4_ = fVar141;
      auVar108._12_4_ = fVar141;
      local_750 = vfmadd231ps_fma(auVar163,auVar108,
                                  *(undefined1 (*) [16])(lVar101 + lVar24 * uVar99));
      local_760 = vfmadd231ps_fma(auVar203,auVar108,
                                  *(undefined1 (*) [16])(lVar101 + lVar24 * (uVar99 + 1)));
      local_770 = vfmadd231ps_fma(auVar143,auVar108,
                                  *(undefined1 (*) [16])(lVar101 + lVar24 * (uVar99 + 2)));
      _local_780 = vfmadd231ps_fma(auVar158,auVar108,
                                   *(undefined1 (*) [16])(lVar101 + lVar24 * (uVar99 + 3)));
      iVar15 = (int)pGVar104[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar24 = (long)iVar15 * 0x44;
      aVar3 = (local_7f0->super_RayK<1>).org.field_0;
      auVar143 = local_750;
      auVar6 = vsubps_avx(local_750,(undefined1  [16])aVar3);
      uVar105 = auVar6._0_4_;
      auVar125._4_4_ = uVar105;
      auVar125._0_4_ = uVar105;
      auVar125._8_4_ = uVar105;
      auVar125._12_4_ = uVar105;
      auVar166 = vshufps_avx(auVar6,auVar6,0x55);
      auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
      aVar4 = (local_738->ray_space).vx.field_0;
      aVar5 = (local_738->ray_space).vy.field_0;
      fVar141 = (local_738->ray_space).vz.field_0.m128[0];
      fVar140 = (local_738->ray_space).vz.field_0.m128[1];
      fVar119 = (local_738->ray_space).vz.field_0.m128[2];
      fVar120 = (local_738->ray_space).vz.field_0.m128[3];
      auVar198._0_4_ = auVar6._0_4_ * fVar141;
      auVar198._4_4_ = auVar6._4_4_ * fVar140;
      auVar198._8_4_ = auVar6._8_4_ * fVar119;
      auVar198._12_4_ = auVar6._12_4_ * fVar120;
      auVar166 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar166);
      auVar10 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar4,auVar125);
      auVar166 = vblendps_avx(auVar10,local_750,8);
      auVar108 = local_760;
      auVar7 = vsubps_avx(local_760,(undefined1  [16])aVar3);
      uVar105 = auVar7._0_4_;
      auVar144._4_4_ = uVar105;
      auVar144._0_4_ = uVar105;
      auVar144._8_4_ = uVar105;
      auVar144._12_4_ = uVar105;
      auVar6 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar199._0_4_ = auVar7._0_4_ * fVar141;
      auVar199._4_4_ = auVar7._4_4_ * fVar140;
      auVar199._8_4_ = auVar7._8_4_ * fVar119;
      auVar199._12_4_ = auVar7._12_4_ * fVar120;
      auVar6 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar5,auVar6);
      auVar11 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar4,auVar144);
      auVar6 = vblendps_avx(auVar11,local_760,8);
      auVar142 = local_770;
      auVar8 = vsubps_avx(local_770,(undefined1  [16])aVar3);
      uVar105 = auVar8._0_4_;
      auVar182._4_4_ = uVar105;
      auVar182._0_4_ = uVar105;
      auVar182._8_4_ = uVar105;
      auVar182._12_4_ = uVar105;
      auVar7 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      auVar205._0_4_ = auVar8._0_4_ * fVar141;
      auVar205._4_4_ = auVar8._4_4_ * fVar140;
      auVar205._8_4_ = auVar8._8_4_ * fVar119;
      auVar205._12_4_ = auVar8._12_4_ * fVar120;
      auVar7 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar5,auVar7);
      auVar12 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar4,auVar182);
      auVar7 = vblendps_avx(auVar12,local_770,8);
      local_540._0_16_ = (undefined1  [16])aVar3;
      auVar107 = _local_780;
      auVar9 = vsubps_avx(_local_780,(undefined1  [16])aVar3);
      auVar8 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar208._0_4_ = auVar8._0_4_ * fVar141;
      auVar208._4_4_ = auVar8._4_4_ * fVar140;
      auVar208._8_4_ = auVar8._8_4_ * fVar119;
      auVar208._12_4_ = auVar8._12_4_ * fVar120;
      uVar105 = auVar9._0_4_;
      auVar176._4_4_ = uVar105;
      auVar176._0_4_ = uVar105;
      auVar176._8_4_ = uVar105;
      auVar176._12_4_ = uVar105;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar8 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar8);
      auVar13 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar4,auVar176);
      auVar8 = vblendps_avx(auVar13,_local_780,8);
      auVar25._4_4_ = uStack_2cc;
      auVar25._0_4_ = local_2d0;
      auVar25._8_4_ = uStack_2c8;
      auVar25._12_4_ = uStack_2c4;
      auVar166 = vandps_avx(auVar166,auVar25);
      auVar6 = vandps_avx(auVar6,auVar25);
      auVar9 = vmaxps_avx(auVar166,auVar6);
      auVar166 = vandps_avx(auVar7,auVar25);
      auVar6 = vandps_avx(auVar8,auVar25);
      auVar166 = vmaxps_avx(auVar166,auVar6);
      auVar166 = vmaxps_avx(auVar9,auVar166);
      auVar6 = vmovshdup_avx(auVar166);
      auVar6 = vmaxss_avx(auVar6,auVar166);
      auVar166 = vshufpd_avx(auVar166,auVar166,1);
      auVar166 = vmaxss_avx(auVar166,auVar6);
      auVar6 = vmovshdup_avx(auVar10);
      uVar106 = auVar6._0_8_;
      local_4c0._8_8_ = uVar106;
      local_4c0._0_8_ = uVar106;
      local_4c0._16_8_ = uVar106;
      local_4c0._24_8_ = uVar106;
      auVar6 = vmovshdup_avx(auVar11);
      uVar106 = auVar6._0_8_;
      local_4e0._8_8_ = uVar106;
      local_4e0._0_8_ = uVar106;
      local_4e0._16_8_ = uVar106;
      local_4e0._24_8_ = uVar106;
      auVar184 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x908);
      local_7c0._0_16_ = auVar12;
      uVar215 = auVar12._0_4_;
      local_640._4_4_ = uVar215;
      local_640._0_4_ = uVar215;
      local_640._8_4_ = uVar215;
      local_640._12_4_ = uVar215;
      local_640._16_4_ = uVar215;
      local_640._20_4_ = uVar215;
      local_640._24_4_ = uVar215;
      local_640._28_4_ = uVar215;
      auVar6 = vmovshdup_avx(auVar12);
      uVar106 = auVar6._0_8_;
      local_5a0._8_8_ = uVar106;
      local_5a0._0_8_ = uVar106;
      local_5a0._16_8_ = uVar106;
      local_5a0._24_8_ = uVar106;
      auVar6 = vmovshdup_avx(auVar13);
      local_480 = auVar6._0_8_;
      local_3a0 = *(float *)(bspline_basis0 + lVar24 + 0xd8c);
      fStack_39c = *(float *)(bspline_basis0 + lVar24 + 0xd90);
      fStack_398 = *(float *)(bspline_basis0 + lVar24 + 0xd94);
      fStack_394 = *(float *)(bspline_basis0 + lVar24 + 0xd98);
      fStack_390 = *(float *)(bspline_basis0 + lVar24 + 0xd9c);
      fStack_38c = *(float *)(bspline_basis0 + lVar24 + 0xda0);
      fStack_388 = *(float *)(bspline_basis0 + lVar24 + 0xda4);
      local_4a0 = auVar13._0_4_;
      auVar126._0_4_ = local_3a0 * local_4a0;
      auVar126._4_4_ = fStack_39c * local_4a0;
      auVar126._8_4_ = fStack_398 * local_4a0;
      auVar126._12_4_ = fStack_394 * local_4a0;
      auVar126._16_4_ = fStack_390 * local_4a0;
      auVar126._20_4_ = fStack_38c * local_4a0;
      auVar126._24_4_ = fStack_388 * local_4a0;
      auVar126._28_4_ = 0;
      auVar7 = vfmadd231ps_fma(auVar126,auVar184,local_640);
      fVar216 = auVar6._0_4_;
      auVar177._0_4_ = fVar216 * local_3a0;
      fVar219 = auVar6._4_4_;
      auVar177._4_4_ = fVar219 * fStack_39c;
      auVar177._8_4_ = fVar216 * fStack_398;
      auVar177._12_4_ = fVar219 * fStack_394;
      auVar177._16_4_ = fVar216 * fStack_390;
      auVar177._20_4_ = fVar219 * fStack_38c;
      auVar177._24_4_ = fVar216 * fStack_388;
      auVar177._28_4_ = 0;
      auVar6 = vfmadd231ps_fma(auVar177,auVar184,local_5a0);
      auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x484);
      uVar105 = auVar11._0_4_;
      local_620._4_4_ = uVar105;
      local_620._0_4_ = uVar105;
      local_620._8_4_ = uVar105;
      local_620._12_4_ = uVar105;
      local_620._16_4_ = uVar105;
      local_620._20_4_ = uVar105;
      local_620._24_4_ = uVar105;
      local_620._28_4_ = uVar105;
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar114,local_620);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar114,local_4e0);
      auVar131 = *(undefined1 (*) [32])(bspline_basis0 + lVar24);
      uVar105 = auVar10._0_4_;
      local_6e0._4_4_ = uVar105;
      local_6e0._0_4_ = uVar105;
      local_6e0._8_4_ = uVar105;
      local_6e0._12_4_ = uVar105;
      local_6e0._16_4_ = uVar105;
      local_6e0._20_4_ = uVar105;
      local_6e0._24_4_ = uVar105;
      local_6e0._28_4_ = uVar105;
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar131,local_6e0);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar131,local_4c0);
      auVar202 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x908);
      fVar87 = *(float *)(bspline_basis1 + lVar24 + 0xd8c);
      fVar88 = *(float *)(bspline_basis1 + lVar24 + 0xd90);
      fVar89 = *(float *)(bspline_basis1 + lVar24 + 0xd94);
      fVar90 = *(float *)(bspline_basis1 + lVar24 + 0xd98);
      fVar91 = *(float *)(bspline_basis1 + lVar24 + 0xd9c);
      fVar92 = *(float *)(bspline_basis1 + lVar24 + 0xda0);
      fVar93 = *(float *)(bspline_basis1 + lVar24 + 0xda4);
      fStack_49c = local_4a0;
      fStack_498 = local_4a0;
      fStack_494 = local_4a0;
      fStack_490 = local_4a0;
      fStack_48c = local_4a0;
      fStack_488 = local_4a0;
      fStack_484 = local_4a0;
      auVar26._4_4_ = fVar88 * local_4a0;
      auVar26._0_4_ = fVar87 * local_4a0;
      auVar26._8_4_ = fVar89 * local_4a0;
      auVar26._12_4_ = fVar90 * local_4a0;
      auVar26._16_4_ = fVar91 * local_4a0;
      auVar26._20_4_ = fVar92 * local_4a0;
      auVar26._24_4_ = fVar93 * local_4a0;
      auVar26._28_4_ = local_4a0;
      auVar8 = vfmadd231ps_fma(auVar26,auVar202,local_640);
      uStack_478 = local_480;
      uStack_470 = local_480;
      uStack_468 = local_480;
      auVar27._4_4_ = fVar219 * fVar88;
      auVar27._0_4_ = fVar216 * fVar87;
      auVar27._8_4_ = fVar216 * fVar89;
      auVar27._12_4_ = fVar219 * fVar90;
      auVar27._16_4_ = fVar216 * fVar91;
      auVar27._20_4_ = fVar219 * fVar92;
      auVar27._24_4_ = fVar216 * fVar93;
      auVar27._28_4_ = uVar215;
      auVar9 = vfmadd231ps_fma(auVar27,auVar202,local_5a0);
      auVar195 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x484);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar195,local_620);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar195,local_4e0);
      auVar116 = *(undefined1 (*) [32])(bspline_basis1 + lVar24);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar116,local_6e0);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar116,local_4c0);
      local_320 = ZEXT1632(auVar8);
      local_300 = ZEXT1632(auVar7);
      auVar222 = vsubps_avx(local_320,local_300);
      local_340 = ZEXT1632(auVar9);
      local_360 = ZEXT1632(auVar6);
      local_380 = vsubps_avx(local_340,local_360);
      auVar109._0_4_ = auVar222._0_4_ * auVar6._0_4_;
      auVar109._4_4_ = auVar222._4_4_ * auVar6._4_4_;
      auVar109._8_4_ = auVar222._8_4_ * auVar6._8_4_;
      auVar109._12_4_ = auVar222._12_4_ * auVar6._12_4_;
      auVar109._16_4_ = auVar222._16_4_ * 0.0;
      auVar109._20_4_ = auVar222._20_4_ * 0.0;
      auVar109._24_4_ = auVar222._24_4_ * 0.0;
      auVar109._28_4_ = 0;
      fVar141 = local_380._0_4_;
      auVar127._0_4_ = auVar7._0_4_ * fVar141;
      fVar119 = local_380._4_4_;
      auVar127._4_4_ = auVar7._4_4_ * fVar119;
      fVar121 = local_380._8_4_;
      auVar127._8_4_ = auVar7._8_4_ * fVar121;
      fVar122 = local_380._12_4_;
      auVar127._12_4_ = auVar7._12_4_ * fVar122;
      fVar123 = local_380._16_4_;
      auVar127._16_4_ = fVar123 * 0.0;
      fVar124 = local_380._20_4_;
      auVar127._20_4_ = fVar124 * 0.0;
      fVar190 = local_380._24_4_;
      auVar127._24_4_ = fVar190 * 0.0;
      auVar127._28_4_ = 0;
      auVar22 = vsubps_avx(auVar109,auVar127);
      auVar6 = vpermilps_avx(local_750,0xff);
      uVar106 = auVar6._0_8_;
      local_a0._8_8_ = uVar106;
      local_a0._0_8_ = uVar106;
      local_a0._16_8_ = uVar106;
      local_a0._24_8_ = uVar106;
      auVar7 = vpermilps_avx(local_760,0xff);
      uVar106 = auVar7._0_8_;
      local_c0._8_8_ = uVar106;
      local_c0._0_8_ = uVar106;
      local_c0._16_8_ = uVar106;
      local_c0._24_8_ = uVar106;
      auVar7 = vpermilps_avx(local_770,0xff);
      uVar106 = auVar7._0_8_;
      local_e0._8_8_ = uVar106;
      local_e0._0_8_ = uVar106;
      local_e0._16_8_ = uVar106;
      local_e0._24_8_ = uVar106;
      auVar7 = vpermilps_avx(_local_780,0xff);
      local_100 = auVar7._0_8_;
      iStack_384 = *(undefined4 *)(bspline_basis0 + lVar24 + 0xda8);
      fVar140 = auVar7._0_4_;
      fVar120 = auVar7._4_4_;
      auVar28._4_4_ = fStack_39c * fVar120;
      auVar28._0_4_ = local_3a0 * fVar140;
      auVar28._8_4_ = fStack_398 * fVar140;
      auVar28._12_4_ = fStack_394 * fVar120;
      auVar28._16_4_ = fStack_390 * fVar140;
      auVar28._20_4_ = fStack_38c * fVar120;
      auVar28._24_4_ = fStack_388 * fVar140;
      auVar28._28_4_ = *(undefined4 *)(bspline_basis0 + lVar24 + 0xda8);
      auVar7 = vfmadd231ps_fma(auVar28,auVar184,local_e0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar114,local_c0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar131,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar29._4_4_ = fVar88 * fVar120;
      auVar29._0_4_ = fVar87 * fVar140;
      auVar29._8_4_ = fVar89 * fVar140;
      auVar29._12_4_ = fVar90 * fVar120;
      auVar29._16_4_ = fVar91 * fVar140;
      auVar29._20_4_ = fVar92 * fVar120;
      auVar29._24_4_ = fVar93 * fVar140;
      auVar29._28_4_ = fVar120;
      auVar8 = vfmadd231ps_fma(auVar29,auVar202,local_e0);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar195,local_c0);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar116,local_a0);
      auVar30._4_4_ = fVar119 * fVar119;
      auVar30._0_4_ = fVar141 * fVar141;
      auVar30._8_4_ = fVar121 * fVar121;
      auVar30._12_4_ = fVar122 * fVar122;
      auVar30._16_4_ = fVar123 * fVar123;
      auVar30._20_4_ = fVar124 * fVar124;
      auVar30._24_4_ = fVar190 * fVar190;
      auVar30._28_4_ = auVar6._4_4_;
      auVar6 = vfmadd231ps_fma(auVar30,auVar222,auVar222);
      local_660 = ZEXT1632(auVar7);
      auVar19 = vmaxps_avx(local_660,ZEXT1632(auVar8));
      auVar31._4_4_ = auVar19._4_4_ * auVar19._4_4_ * auVar6._4_4_;
      auVar31._0_4_ = auVar19._0_4_ * auVar19._0_4_ * auVar6._0_4_;
      auVar31._8_4_ = auVar19._8_4_ * auVar19._8_4_ * auVar6._8_4_;
      auVar31._12_4_ = auVar19._12_4_ * auVar19._12_4_ * auVar6._12_4_;
      auVar31._16_4_ = auVar19._16_4_ * auVar19._16_4_ * 0.0;
      auVar31._20_4_ = auVar19._20_4_ * auVar19._20_4_ * 0.0;
      auVar31._24_4_ = auVar19._24_4_ * auVar19._24_4_ * 0.0;
      auVar31._28_4_ = auVar19._28_4_;
      auVar32._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar32._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar32._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar32._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar32._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar32._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar32._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar32._28_4_ = auVar22._28_4_;
      auVar19 = vcmpps_avx(auVar32,auVar31,2);
      auVar110._0_4_ = (float)iVar15;
      local_500._4_12_ = auVar13._4_12_;
      local_500._0_4_ = auVar110._0_4_;
      fVar141 = auVar166._0_4_ * 4.7683716e-07;
      local_500._16_16_ = auVar134._16_16_;
      auVar110._4_4_ = auVar110._0_4_;
      auVar110._8_4_ = auVar110._0_4_;
      auVar110._12_4_ = auVar110._0_4_;
      auVar110._16_4_ = auVar110._0_4_;
      auVar110._20_4_ = auVar110._0_4_;
      auVar110._24_4_ = auVar110._0_4_;
      auVar110._28_4_ = auVar110._0_4_;
      auVar134 = vcmpps_avx(_DAT_01faff40,auVar110,1);
      auVar166 = vpermilps_avx(auVar10,0xaa);
      uVar106 = auVar166._0_8_;
      auVar173._8_8_ = uVar106;
      auVar173._0_8_ = uVar106;
      auVar173._16_8_ = uVar106;
      auVar173._24_8_ = uVar106;
      auVar166 = vpermilps_avx(auVar11,0xaa);
      uVar106 = auVar166._0_8_;
      auVar188._8_8_ = uVar106;
      auVar188._0_8_ = uVar106;
      auVar188._16_8_ = uVar106;
      auVar188._24_8_ = uVar106;
      auVar166 = vpermilps_avx(auVar12,0xaa);
      uVar106 = auVar166._0_8_;
      auVar217._8_8_ = uVar106;
      auVar217._0_8_ = uVar106;
      auVar217._16_8_ = uVar106;
      auVar217._24_8_ = uVar106;
      auVar166 = vshufps_avx(auVar13,auVar13,0xaa);
      uVar106 = auVar166._0_8_;
      register0x00001508 = uVar106;
      local_5e0 = uVar106;
      register0x00001510 = uVar106;
      register0x00001518 = uVar106;
      auVar210 = ZEXT3264(_local_5e0);
      auVar22 = auVar134 & auVar19;
      ray = local_7f0;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0x7f,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0xbf,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f])
      {
        auVar139 = ZEXT3264(local_640);
        auVar162 = ZEXT3264(local_5a0);
        auVar223 = ZEXT3264(local_620);
        auVar207 = ZEXT3264(local_6e0);
      }
      else {
        _local_3c0 = vandps_avx(auVar19,auVar134);
        fVar190 = auVar166._0_4_;
        fVar211 = auVar166._4_4_;
        auVar33._4_4_ = fVar211 * fVar88;
        auVar33._0_4_ = fVar190 * fVar87;
        auVar33._8_4_ = fVar190 * fVar89;
        auVar33._12_4_ = fVar211 * fVar90;
        auVar33._16_4_ = fVar190 * fVar91;
        auVar33._20_4_ = fVar211 * fVar92;
        auVar33._24_4_ = fVar190 * fVar93;
        auVar33._28_4_ = local_3c0._28_4_;
        auVar166 = vfmadd213ps_fma(auVar202,auVar217,auVar33);
        auVar166 = vfmadd213ps_fma(auVar195,auVar188,ZEXT1632(auVar166));
        auVar166 = vfmadd213ps_fma(auVar116,auVar173,ZEXT1632(auVar166));
        local_3e0 = ZEXT1632(auVar166);
        auVar34._4_4_ = fVar211 * fStack_39c;
        auVar34._0_4_ = fVar190 * local_3a0;
        auVar34._8_4_ = fVar190 * fStack_398;
        auVar34._12_4_ = fVar211 * fStack_394;
        auVar34._16_4_ = fVar190 * fStack_390;
        auVar34._20_4_ = fVar211 * fStack_38c;
        auVar34._24_4_ = fVar190 * fStack_388;
        auVar34._28_4_ = local_3c0._28_4_;
        auVar166 = vfmadd213ps_fma(auVar184,auVar217,auVar34);
        auVar166 = vfmadd213ps_fma(auVar114,auVar188,ZEXT1632(auVar166));
        local_6c0 = auVar188;
        auVar134 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1210);
        auVar184 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1694);
        auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1b18);
        local_700 = auVar173;
        fVar140 = *(float *)(bspline_basis0 + lVar24 + 0x1f9c);
        fVar119 = *(float *)(bspline_basis0 + lVar24 + 0x1fa0);
        fVar120 = *(float *)(bspline_basis0 + lVar24 + 0x1fa4);
        fVar121 = *(float *)(bspline_basis0 + lVar24 + 0x1fa8);
        fVar122 = *(float *)(bspline_basis0 + lVar24 + 0x1fac);
        fVar123 = *(float *)(bspline_basis0 + lVar24 + 0x1fb0);
        fVar124 = *(float *)(bspline_basis0 + lVar24 + 0x1fb4);
        auVar178._0_4_ = local_4a0 * fVar140;
        auVar178._4_4_ = local_4a0 * fVar119;
        auVar178._8_4_ = local_4a0 * fVar120;
        auVar178._12_4_ = local_4a0 * fVar121;
        auVar178._16_4_ = local_4a0 * fVar122;
        auVar178._20_4_ = local_4a0 * fVar123;
        auVar178._24_4_ = local_4a0 * fVar124;
        auVar178._28_4_ = 0;
        local_7c0._0_16_ = ZEXT416((uint)fVar141);
        auVar194._0_4_ = fVar216 * fVar140;
        auVar194._4_4_ = fVar219 * fVar119;
        auVar194._8_4_ = fVar216 * fVar120;
        auVar194._12_4_ = fVar219 * fVar121;
        auVar194._16_4_ = fVar216 * fVar122;
        auVar194._20_4_ = fVar219 * fVar123;
        auVar194._24_4_ = fVar216 * fVar124;
        auVar194._28_4_ = 0;
        auVar204._0_4_ = fVar140 * fVar190;
        auVar204._4_4_ = fVar119 * fVar211;
        auVar204._8_4_ = fVar120 * fVar190;
        auVar204._12_4_ = fVar121 * fVar211;
        auVar204._16_4_ = fVar122 * fVar190;
        auVar204._20_4_ = fVar123 * fVar211;
        auVar204._24_4_ = fVar124 * fVar190;
        auVar204._28_4_ = 0;
        auVar6 = vfmadd231ps_fma(auVar178,auVar114,local_640);
        auVar7 = vfmadd231ps_fma(auVar194,auVar114,local_5a0);
        auVar9 = vfmadd231ps_fma(auVar204,auVar217,auVar114);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar184,local_620);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar184,local_4e0);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar188,auVar184);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar134,local_6e0);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar134,local_4c0);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar134,auVar173);
        fVar140 = *(float *)(bspline_basis1 + lVar24 + 0x1f9c);
        fVar119 = *(float *)(bspline_basis1 + lVar24 + 0x1fa0);
        fVar120 = *(float *)(bspline_basis1 + lVar24 + 0x1fa4);
        fVar121 = *(float *)(bspline_basis1 + lVar24 + 0x1fa8);
        fVar122 = *(float *)(bspline_basis1 + lVar24 + 0x1fac);
        fVar123 = *(float *)(bspline_basis1 + lVar24 + 0x1fb0);
        fVar124 = *(float *)(bspline_basis1 + lVar24 + 0x1fb4);
        auVar184._4_4_ = local_4a0 * fVar119;
        auVar184._0_4_ = local_4a0 * fVar140;
        auVar184._8_4_ = local_4a0 * fVar120;
        auVar184._12_4_ = local_4a0 * fVar121;
        auVar184._16_4_ = local_4a0 * fVar122;
        auVar184._20_4_ = local_4a0 * fVar123;
        auVar184._24_4_ = local_4a0 * fVar124;
        auVar184._28_4_ = local_4a0;
        auVar35._4_4_ = fVar219 * fVar119;
        auVar35._0_4_ = fVar216 * fVar140;
        auVar35._8_4_ = fVar216 * fVar120;
        auVar35._12_4_ = fVar219 * fVar121;
        auVar35._16_4_ = fVar216 * fVar122;
        auVar35._20_4_ = fVar219 * fVar123;
        auVar35._24_4_ = fVar216 * fVar124;
        auVar35._28_4_ = fVar219;
        auVar36._4_4_ = fVar211 * fVar119;
        auVar36._0_4_ = fVar190 * fVar140;
        auVar36._8_4_ = fVar190 * fVar120;
        auVar36._12_4_ = fVar211 * fVar121;
        auVar36._16_4_ = fVar190 * fVar122;
        auVar36._20_4_ = fVar211 * fVar123;
        auVar36._24_4_ = fVar190 * fVar124;
        auVar36._28_4_ = fVar211;
        auVar134 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1b18);
        auVar10 = vfmadd231ps_fma(auVar184,auVar134,local_640);
        auVar11 = vfmadd231ps_fma(auVar35,auVar134,local_5a0);
        local_5c0 = auVar217;
        auVar12 = vfmadd231ps_fma(auVar36,auVar217,auVar134);
        auVar134 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1694);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar134,local_620);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,local_4e0);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar134,auVar188);
        auVar134 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1210);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar134,local_6e0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar134,local_4c0);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar173,auVar134);
        auVar134 = vandps_avx(local_180,ZEXT1632(auVar6));
        auVar184 = vandps_avx(ZEXT1632(auVar7),local_180);
        auVar184 = vmaxps_avx(auVar134,auVar184);
        auVar134 = vandps_avx(ZEXT1632(auVar9),local_180);
        auVar134 = vmaxps_avx(auVar184,auVar134);
        auVar128._4_4_ = fVar141;
        auVar128._0_4_ = fVar141;
        auVar128._8_4_ = fVar141;
        auVar128._12_4_ = fVar141;
        auVar128._16_4_ = fVar141;
        auVar128._20_4_ = fVar141;
        auVar128._24_4_ = fVar141;
        auVar128._28_4_ = fVar141;
        auVar134 = vcmpps_avx(auVar134,auVar128,1);
        auVar114 = vblendvps_avx(ZEXT1632(auVar6),auVar222,auVar134);
        auVar202 = vblendvps_avx(ZEXT1632(auVar7),local_380,auVar134);
        auVar134 = vandps_avx(ZEXT1632(auVar10),local_180);
        auVar184 = vandps_avx(ZEXT1632(auVar11),local_180);
        auVar184 = vmaxps_avx(auVar134,auVar184);
        auVar134 = vandps_avx(ZEXT1632(auVar12),local_180);
        auVar134 = vmaxps_avx(auVar184,auVar134);
        auVar184 = vcmpps_avx(auVar134,auVar128,1);
        auVar134 = vblendvps_avx(ZEXT1632(auVar10),auVar222,auVar184);
        auVar184 = vblendvps_avx(ZEXT1632(auVar11),local_380,auVar184);
        auVar166 = vfmadd213ps_fma(auVar131,auVar173,ZEXT1632(auVar166));
        fVar190 = -auVar134._4_4_;
        auVar6 = vfmadd213ps_fma(auVar114,auVar114,ZEXT832(0) << 0x20);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar202,auVar202);
        auVar131 = vrsqrtps_avx(ZEXT1632(auVar6));
        fVar140 = auVar131._0_4_;
        fVar119 = auVar131._4_4_;
        fVar120 = auVar131._8_4_;
        fVar121 = auVar131._12_4_;
        fVar122 = auVar131._16_4_;
        fVar123 = auVar131._20_4_;
        fVar124 = auVar131._24_4_;
        auVar37._4_4_ = fVar119 * fVar119 * fVar119 * auVar6._4_4_ * -0.5;
        auVar37._0_4_ = fVar140 * fVar140 * fVar140 * auVar6._0_4_ * -0.5;
        auVar37._8_4_ = fVar120 * fVar120 * fVar120 * auVar6._8_4_ * -0.5;
        auVar37._12_4_ = fVar121 * fVar121 * fVar121 * auVar6._12_4_ * -0.5;
        auVar37._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar37._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar37._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar37._28_4_ = 0;
        auVar214._8_4_ = 0x3fc00000;
        auVar214._0_8_ = 0x3fc000003fc00000;
        auVar214._12_4_ = 0x3fc00000;
        auVar214._16_4_ = 0x3fc00000;
        auVar214._20_4_ = 0x3fc00000;
        auVar214._24_4_ = 0x3fc00000;
        auVar214._28_4_ = 0x3fc00000;
        auVar6 = vfmadd231ps_fma(auVar37,auVar214,auVar131);
        fVar140 = auVar6._0_4_;
        fVar119 = auVar6._4_4_;
        auVar38._4_4_ = auVar202._4_4_ * fVar119;
        auVar38._0_4_ = auVar202._0_4_ * fVar140;
        fVar120 = auVar6._8_4_;
        auVar38._8_4_ = auVar202._8_4_ * fVar120;
        fVar121 = auVar6._12_4_;
        auVar38._12_4_ = auVar202._12_4_ * fVar121;
        auVar38._16_4_ = auVar202._16_4_ * 0.0;
        auVar38._20_4_ = auVar202._20_4_ * 0.0;
        auVar38._24_4_ = auVar202._24_4_ * 0.0;
        auVar38._28_4_ = auVar131._28_4_;
        auVar39._4_4_ = -auVar114._4_4_ * fVar119;
        auVar39._0_4_ = -auVar114._0_4_ * fVar140;
        auVar39._8_4_ = -auVar114._8_4_ * fVar120;
        auVar39._12_4_ = -auVar114._12_4_ * fVar121;
        auVar39._16_4_ = -auVar114._16_4_ * 0.0;
        auVar39._20_4_ = -auVar114._20_4_ * 0.0;
        auVar39._24_4_ = -auVar114._24_4_ * 0.0;
        auVar39._28_4_ = 0;
        auVar6 = vfmadd213ps_fma(auVar134,auVar134,ZEXT832(0) << 0x20);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar184,auVar184);
        auVar114 = vrsqrtps_avx(ZEXT1632(auVar6));
        auVar131 = ZEXT1632(CONCAT412(fVar121 * 0.0,
                                      CONCAT48(fVar120 * 0.0,CONCAT44(fVar119 * 0.0,fVar140 * 0.0)))
                           );
        fVar140 = auVar114._0_4_;
        fVar119 = auVar114._4_4_;
        fVar120 = auVar114._8_4_;
        fVar121 = auVar114._12_4_;
        fVar122 = auVar114._16_4_;
        fVar123 = auVar114._20_4_;
        fVar124 = auVar114._24_4_;
        auVar40._4_4_ = fVar119 * fVar119 * fVar119 * auVar6._4_4_ * -0.5;
        auVar40._0_4_ = fVar140 * fVar140 * fVar140 * auVar6._0_4_ * -0.5;
        auVar40._8_4_ = fVar120 * fVar120 * fVar120 * auVar6._8_4_ * -0.5;
        auVar40._12_4_ = fVar121 * fVar121 * fVar121 * auVar6._12_4_ * -0.5;
        auVar40._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar40._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar40._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar40._28_4_ = 0xbf000000;
        auVar6 = vfmadd231ps_fma(auVar40,auVar214,auVar114);
        fVar140 = auVar6._0_4_;
        fVar119 = auVar6._4_4_;
        auVar41._4_4_ = fVar119 * auVar184._4_4_;
        auVar41._0_4_ = fVar140 * auVar184._0_4_;
        fVar120 = auVar6._8_4_;
        auVar41._8_4_ = fVar120 * auVar184._8_4_;
        fVar121 = auVar6._12_4_;
        auVar41._12_4_ = fVar121 * auVar184._12_4_;
        auVar41._16_4_ = auVar184._16_4_ * 0.0;
        auVar41._20_4_ = auVar184._20_4_ * 0.0;
        auVar41._24_4_ = auVar184._24_4_ * 0.0;
        auVar41._28_4_ = 0;
        auVar42._4_4_ = fVar119 * fVar190;
        auVar42._0_4_ = fVar140 * -auVar134._0_4_;
        auVar42._8_4_ = fVar120 * -auVar134._8_4_;
        auVar42._12_4_ = fVar121 * -auVar134._12_4_;
        auVar42._16_4_ = -auVar134._16_4_ * 0.0;
        auVar42._20_4_ = -auVar134._20_4_ * 0.0;
        auVar42._24_4_ = -auVar134._24_4_ * 0.0;
        auVar42._28_4_ = 0x3fc00000;
        auVar43._28_4_ = auVar114._28_4_;
        auVar43._0_28_ =
             ZEXT1628(CONCAT412(fVar121 * 0.0,
                                CONCAT48(fVar120 * 0.0,CONCAT44(fVar119 * 0.0,fVar140 * 0.0))));
        auVar6 = vfmadd213ps_fma(auVar38,local_660,local_300);
        auVar7 = vfmadd213ps_fma(auVar39,local_660,local_360);
        auVar9 = vfmadd213ps_fma(auVar131,local_660,ZEXT1632(auVar166));
        auVar13 = vfnmadd213ps_fma(auVar38,local_660,local_300);
        auVar10 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar8),local_320);
        auVar25 = vfnmadd213ps_fma(auVar39,local_660,local_360);
        auVar184 = ZEXT1632(auVar8);
        auVar11 = vfmadd213ps_fma(auVar42,auVar184,local_340);
        auVar158 = vfnmadd231ps_fma(ZEXT1632(auVar166),local_660,auVar131);
        auVar12 = vfmadd213ps_fma(auVar43,auVar184,local_3e0);
        auVar125 = vfnmadd213ps_fma(auVar41,auVar184,local_320);
        auVar144 = vfnmadd213ps_fma(auVar42,auVar184,local_340);
        local_520 = ZEXT1632(auVar8);
        auVar163 = vfnmadd231ps_fma(local_3e0,local_520,auVar43);
        auVar184 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar25));
        auVar114 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar158));
        auVar155._0_4_ = auVar158._0_4_ * auVar184._0_4_;
        auVar155._4_4_ = auVar158._4_4_ * auVar184._4_4_;
        auVar155._8_4_ = auVar158._8_4_ * auVar184._8_4_;
        auVar155._12_4_ = auVar158._12_4_ * auVar184._12_4_;
        auVar155._16_4_ = auVar184._16_4_ * 0.0;
        auVar155._20_4_ = auVar184._20_4_ * 0.0;
        auVar155._24_4_ = auVar184._24_4_ * 0.0;
        auVar155._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar155,ZEXT1632(auVar25),auVar114);
        auVar44._4_4_ = auVar13._4_4_ * auVar114._4_4_;
        auVar44._0_4_ = auVar13._0_4_ * auVar114._0_4_;
        auVar44._8_4_ = auVar13._8_4_ * auVar114._8_4_;
        auVar44._12_4_ = auVar13._12_4_ * auVar114._12_4_;
        auVar44._16_4_ = auVar114._16_4_ * 0.0;
        auVar44._20_4_ = auVar114._20_4_ * 0.0;
        auVar44._24_4_ = auVar114._24_4_ * 0.0;
        auVar44._28_4_ = auVar114._28_4_;
        auVar195 = ZEXT1632(auVar13);
        auVar114 = vsubps_avx(ZEXT1632(auVar10),auVar195);
        auVar166 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar158),auVar114);
        auVar45._4_4_ = auVar25._4_4_ * auVar114._4_4_;
        auVar45._0_4_ = auVar25._0_4_ * auVar114._0_4_;
        auVar45._8_4_ = auVar25._8_4_ * auVar114._8_4_;
        auVar45._12_4_ = auVar25._12_4_ * auVar114._12_4_;
        auVar45._16_4_ = auVar114._16_4_ * 0.0;
        auVar45._20_4_ = auVar114._20_4_ * 0.0;
        auVar45._24_4_ = auVar114._24_4_ * 0.0;
        auVar45._28_4_ = auVar114._28_4_;
        auVar13 = vfmsub231ps_fma(auVar45,auVar195,auVar184);
        auVar86._4_8_ = 0;
        auVar86._0_4_ = (uint)-auVar134._4_4_ ^ (uint)fVar190;
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1232(auVar86) << 0x20,ZEXT1632(auVar166));
        local_600._16_16_ = auVar222._16_16_;
        local_600._0_16_ = local_3c0._16_16_;
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT1232(auVar86) << 0x20,ZEXT1632(auVar8));
        auVar222 = vcmpps_avx(ZEXT1632(auVar166),ZEXT1232(auVar86) << 0x20,2);
        local_7e0 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar6),auVar222);
        auVar134 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar7),auVar222);
        auVar184 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar9),auVar222);
        auVar114 = vblendvps_avx(auVar195,ZEXT1632(auVar10),auVar222);
        auVar131 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar11),auVar222);
        auVar202 = vblendvps_avx(ZEXT1632(auVar158),ZEXT1632(auVar12),auVar222);
        auVar195 = vblendvps_avx(ZEXT1632(auVar10),auVar195,auVar222);
        auVar116 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar25),auVar222);
        auVar166 = vpackssdw_avx(local_3c0._0_16_,local_3c0._16_16_);
        auVar19 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar158),auVar222);
        auVar22 = vsubps_avx(auVar195,local_7e0);
        auVar116 = vsubps_avx(auVar116,auVar134);
        auVar20 = vsubps_avx(auVar19,auVar184);
        auVar21 = vsubps_avx(local_7e0,auVar114);
        auVar153 = vsubps_avx(auVar134,auVar131);
        auVar154 = vsubps_avx(auVar184,auVar202);
        auVar46._4_4_ = auVar20._4_4_ * local_7e0._4_4_;
        auVar46._0_4_ = auVar20._0_4_ * local_7e0._0_4_;
        auVar46._8_4_ = auVar20._8_4_ * local_7e0._8_4_;
        auVar46._12_4_ = auVar20._12_4_ * local_7e0._12_4_;
        auVar46._16_4_ = auVar20._16_4_ * local_7e0._16_4_;
        auVar46._20_4_ = auVar20._20_4_ * local_7e0._20_4_;
        auVar46._24_4_ = auVar20._24_4_ * local_7e0._24_4_;
        auVar46._28_4_ = auVar19._28_4_;
        auVar6 = vfmsub231ps_fma(auVar46,auVar184,auVar22);
        auVar47._4_4_ = auVar22._4_4_ * auVar134._4_4_;
        auVar47._0_4_ = auVar22._0_4_ * auVar134._0_4_;
        auVar47._8_4_ = auVar22._8_4_ * auVar134._8_4_;
        auVar47._12_4_ = auVar22._12_4_ * auVar134._12_4_;
        auVar47._16_4_ = auVar22._16_4_ * auVar134._16_4_;
        auVar47._20_4_ = auVar22._20_4_ * auVar134._20_4_;
        auVar47._24_4_ = auVar22._24_4_ * auVar134._24_4_;
        auVar47._28_4_ = auVar195._28_4_;
        auVar7 = vfmsub231ps_fma(auVar47,local_7e0,auVar116);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar6));
        auVar111._0_4_ = auVar116._0_4_ * auVar184._0_4_;
        auVar111._4_4_ = auVar116._4_4_ * auVar184._4_4_;
        auVar111._8_4_ = auVar116._8_4_ * auVar184._8_4_;
        auVar111._12_4_ = auVar116._12_4_ * auVar184._12_4_;
        auVar111._16_4_ = auVar116._16_4_ * auVar184._16_4_;
        auVar111._20_4_ = auVar116._20_4_ * auVar184._20_4_;
        auVar111._24_4_ = auVar116._24_4_ * auVar184._24_4_;
        auVar111._28_4_ = 0;
        auVar7 = vfmsub231ps_fma(auVar111,auVar134,auVar20);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
        auVar112._0_4_ = auVar154._0_4_ * auVar114._0_4_;
        auVar112._4_4_ = auVar154._4_4_ * auVar114._4_4_;
        auVar112._8_4_ = auVar154._8_4_ * auVar114._8_4_;
        auVar112._12_4_ = auVar154._12_4_ * auVar114._12_4_;
        auVar112._16_4_ = auVar154._16_4_ * auVar114._16_4_;
        auVar112._20_4_ = auVar154._20_4_ * auVar114._20_4_;
        auVar112._24_4_ = auVar154._24_4_ * auVar114._24_4_;
        auVar112._28_4_ = 0;
        auVar6 = vfmsub231ps_fma(auVar112,auVar21,auVar202);
        auVar48._4_4_ = auVar153._4_4_ * auVar202._4_4_;
        auVar48._0_4_ = auVar153._0_4_ * auVar202._0_4_;
        auVar48._8_4_ = auVar153._8_4_ * auVar202._8_4_;
        auVar48._12_4_ = auVar153._12_4_ * auVar202._12_4_;
        auVar48._16_4_ = auVar153._16_4_ * auVar202._16_4_;
        auVar48._20_4_ = auVar153._20_4_ * auVar202._20_4_;
        auVar48._24_4_ = auVar153._24_4_ * auVar202._24_4_;
        auVar48._28_4_ = auVar202._28_4_;
        auVar8 = vfmsub231ps_fma(auVar48,auVar131,auVar154);
        auVar49._4_4_ = auVar21._4_4_ * auVar131._4_4_;
        auVar49._0_4_ = auVar21._0_4_ * auVar131._0_4_;
        auVar49._8_4_ = auVar21._8_4_ * auVar131._8_4_;
        auVar49._12_4_ = auVar21._12_4_ * auVar131._12_4_;
        auVar49._16_4_ = auVar21._16_4_ * auVar131._16_4_;
        auVar49._20_4_ = auVar21._20_4_ * auVar131._20_4_;
        auVar49._24_4_ = auVar21._24_4_ * auVar131._24_4_;
        auVar49._28_4_ = auVar131._28_4_;
        auVar9 = vfmsub231ps_fma(auVar49,auVar153,auVar114);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar6));
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar114 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
        auVar114 = vcmpps_avx(auVar114,ZEXT832(0) << 0x20,2);
        auVar6 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar166 = vpand_avx(auVar166,auVar6);
        auVar114 = vpmovsxwd_avx2(auVar166);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0x7f,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar114 >> 0xbf,0) == '\0') &&
            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar114[0x1f]) {
LAB_018a6b54:
          auVar175._8_8_ = local_580[1]._8_8_;
          auVar175._0_8_ = local_580[1]._0_8_;
          auVar175._16_8_ = local_580[1]._16_8_;
          auVar175._24_8_ = local_580[1]._24_8_;
        }
        else {
          auVar50._4_4_ = auVar116._4_4_ * auVar154._4_4_;
          auVar50._0_4_ = auVar116._0_4_ * auVar154._0_4_;
          auVar50._8_4_ = auVar116._8_4_ * auVar154._8_4_;
          auVar50._12_4_ = auVar116._12_4_ * auVar154._12_4_;
          auVar50._16_4_ = auVar116._16_4_ * auVar154._16_4_;
          auVar50._20_4_ = auVar116._20_4_ * auVar154._20_4_;
          auVar50._24_4_ = auVar116._24_4_ * auVar154._24_4_;
          auVar50._28_4_ = auVar114._28_4_;
          auVar11 = vfmsub231ps_fma(auVar50,auVar153,auVar20);
          auVar129._0_4_ = auVar21._0_4_ * auVar20._0_4_;
          auVar129._4_4_ = auVar21._4_4_ * auVar20._4_4_;
          auVar129._8_4_ = auVar21._8_4_ * auVar20._8_4_;
          auVar129._12_4_ = auVar21._12_4_ * auVar20._12_4_;
          auVar129._16_4_ = auVar21._16_4_ * auVar20._16_4_;
          auVar129._20_4_ = auVar21._20_4_ * auVar20._20_4_;
          auVar129._24_4_ = auVar21._24_4_ * auVar20._24_4_;
          auVar129._28_4_ = 0;
          auVar10 = vfmsub231ps_fma(auVar129,auVar22,auVar154);
          auVar51._4_4_ = auVar22._4_4_ * auVar153._4_4_;
          auVar51._0_4_ = auVar22._0_4_ * auVar153._0_4_;
          auVar51._8_4_ = auVar22._8_4_ * auVar153._8_4_;
          auVar51._12_4_ = auVar22._12_4_ * auVar153._12_4_;
          auVar51._16_4_ = auVar22._16_4_ * auVar153._16_4_;
          auVar51._20_4_ = auVar22._20_4_ * auVar153._20_4_;
          auVar51._24_4_ = auVar22._24_4_ * auVar153._24_4_;
          auVar51._28_4_ = auVar22._28_4_;
          auVar12 = vfmsub231ps_fma(auVar51,auVar21,auVar116);
          auVar6 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar10),ZEXT1632(auVar12));
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar11),_DAT_01faff00);
          auVar114 = vrcpps_avx(ZEXT1632(auVar9));
          auVar206._8_4_ = 0x3f800000;
          auVar206._0_8_ = 0x3f8000003f800000;
          auVar206._12_4_ = 0x3f800000;
          auVar206._16_4_ = 0x3f800000;
          auVar206._20_4_ = 0x3f800000;
          auVar206._24_4_ = 0x3f800000;
          auVar206._28_4_ = 0x3f800000;
          auVar6 = vfnmadd213ps_fma(auVar114,ZEXT1632(auVar9),auVar206);
          auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar114,auVar114);
          auVar52._4_4_ = auVar12._4_4_ * auVar184._4_4_;
          auVar52._0_4_ = auVar12._0_4_ * auVar184._0_4_;
          auVar52._8_4_ = auVar12._8_4_ * auVar184._8_4_;
          auVar52._12_4_ = auVar12._12_4_ * auVar184._12_4_;
          auVar52._16_4_ = auVar184._16_4_ * 0.0;
          auVar52._20_4_ = auVar184._20_4_ * 0.0;
          auVar52._24_4_ = auVar184._24_4_ * 0.0;
          auVar52._28_4_ = auVar184._28_4_;
          auVar10 = vfmadd231ps_fma(auVar52,auVar134,ZEXT1632(auVar10));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar11),local_7e0);
          fVar119 = auVar6._0_4_;
          fVar120 = auVar6._4_4_;
          fVar121 = auVar6._8_4_;
          fVar122 = auVar6._12_4_;
          auVar53._28_4_ = auVar134._28_4_;
          auVar53._0_28_ =
               ZEXT1628(CONCAT412(fVar122 * auVar10._12_4_,
                                  CONCAT48(fVar121 * auVar10._8_4_,
                                           CONCAT44(fVar120 * auVar10._4_4_,fVar119 * auVar10._0_4_)
                                          )));
          auVar6 = vpermilps_avx((undefined1  [16])aVar3,0xff);
          auVar113._0_8_ = auVar6._0_8_;
          auVar113._8_8_ = auVar113._0_8_;
          auVar113._16_8_ = auVar113._0_8_;
          auVar113._24_8_ = auVar113._0_8_;
          fVar140 = (local_7f0->super_RayK<1>).tfar;
          auVar130._4_4_ = fVar140;
          auVar130._0_4_ = fVar140;
          auVar130._8_4_ = fVar140;
          auVar130._12_4_ = fVar140;
          auVar130._16_4_ = fVar140;
          auVar130._20_4_ = fVar140;
          auVar130._24_4_ = fVar140;
          auVar130._28_4_ = fVar140;
          auVar134 = vcmpps_avx(auVar113,auVar53,2);
          auVar184 = vcmpps_avx(auVar53,auVar130,2);
          auVar134 = vandps_avx(auVar184,auVar134);
          auVar6 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
          auVar166 = vpand_avx(auVar166,auVar6);
          auVar134 = vpmovsxwd_avx2(auVar166);
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar134 >> 0x7f,0) == '\0') &&
                (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0xbf,0) == '\0') &&
              (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar134[0x1f]) goto LAB_018a6b54;
          auVar134 = vcmpps_avx(ZEXT1632(auVar9),ZEXT832(0) << 0x20,4);
          auVar6 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
          auVar166 = vpand_avx(auVar166,auVar6);
          auVar134 = vpmovsxwd_avx2(auVar166);
          auVar175._8_8_ = local_580[1]._8_8_;
          auVar175._0_8_ = local_580[1]._0_8_;
          auVar175._16_8_ = local_580[1]._16_8_;
          auVar175._24_8_ = local_580[1]._24_8_;
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0x7f,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar134 >> 0xbf,0) != '\0') ||
              (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar134[0x1f] < '\0') {
            auVar114 = ZEXT1632(CONCAT412(fVar122 * auVar7._12_4_,
                                          CONCAT48(fVar121 * auVar7._8_4_,
                                                   CONCAT44(fVar120 * auVar7._4_4_,
                                                            fVar119 * auVar7._0_4_))));
            auVar131 = ZEXT1632(CONCAT412(fVar122 * auVar8._12_4_,
                                          CONCAT48(fVar121 * auVar8._8_4_,
                                                   CONCAT44(fVar120 * auVar8._4_4_,
                                                            fVar119 * auVar8._0_4_))));
            auVar174._8_4_ = 0x3f800000;
            auVar174._0_8_ = 0x3f8000003f800000;
            auVar174._12_4_ = 0x3f800000;
            auVar174._16_4_ = 0x3f800000;
            auVar174._20_4_ = 0x3f800000;
            auVar174._24_4_ = 0x3f800000;
            auVar174._28_4_ = 0x3f800000;
            auVar184 = vsubps_avx(auVar174,auVar114);
            _local_160 = vblendvps_avx(auVar184,auVar114,auVar222);
            auVar184 = vsubps_avx(auVar174,auVar131);
            local_420 = vblendvps_avx(auVar184,auVar131,auVar222);
            local_400 = auVar53;
            auVar175 = auVar134;
          }
        }
        auVar223 = ZEXT3264(local_620);
        auVar162 = ZEXT3264(auVar217);
        auVar210 = ZEXT3264(_local_5e0);
        auVar207 = ZEXT3264(local_6e0);
        auVar139 = ZEXT3264(auVar173);
        if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar175 >> 0x7f,0) == '\0') &&
              (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar175 >> 0xbf,0) == '\0') &&
            (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar175[0x1f]) {
          auVar139 = ZEXT3264(local_640);
          auVar162 = ZEXT3264(local_5a0);
        }
        else {
          auVar134 = vsubps_avx(local_520,local_660);
          auVar166 = vfmadd213ps_fma(auVar134,_local_160,local_660);
          fVar140 = local_738->depth_scale;
          auVar54._4_4_ = (auVar166._4_4_ + auVar166._4_4_) * fVar140;
          auVar54._0_4_ = (auVar166._0_4_ + auVar166._0_4_) * fVar140;
          auVar54._8_4_ = (auVar166._8_4_ + auVar166._8_4_) * fVar140;
          auVar54._12_4_ = (auVar166._12_4_ + auVar166._12_4_) * fVar140;
          auVar54._16_4_ = fVar140 * 0.0;
          auVar54._20_4_ = fVar140 * 0.0;
          auVar54._24_4_ = fVar140 * 0.0;
          auVar54._28_4_ = 0;
          auVar134 = vcmpps_avx(local_400,auVar54,6);
          auVar184 = auVar175 & auVar134;
          auVar189 = ZEXT3264(auVar188);
          _local_780 = auVar107;
          local_770 = auVar142;
          local_760 = auVar108;
          local_750 = auVar143;
          if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar184 >> 0x7f,0) != '\0') ||
                (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar184 >> 0xbf,0) != '\0') ||
              (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar184[0x1f] < '\0') {
            auVar132._8_4_ = 0xbf800000;
            auVar132._0_8_ = 0xbf800000bf800000;
            auVar132._12_4_ = 0xbf800000;
            auVar132._16_4_ = 0xbf800000;
            auVar132._20_4_ = 0xbf800000;
            auVar132._24_4_ = 0xbf800000;
            auVar132._28_4_ = 0xbf800000;
            auVar156._8_4_ = 0x40000000;
            auVar156._0_8_ = 0x4000000040000000;
            auVar156._12_4_ = 0x40000000;
            auVar156._16_4_ = 0x40000000;
            auVar156._20_4_ = 0x40000000;
            auVar156._24_4_ = 0x40000000;
            auVar156._28_4_ = 0x40000000;
            auVar166 = vfmadd213ps_fma(local_420,auVar156,auVar132);
            local_2c0 = _local_160;
            local_420 = ZEXT1632(auVar166);
            auVar184 = local_420;
            local_2a0 = ZEXT1632(auVar166);
            local_280 = local_400;
            local_260 = 0;
            local_25c = iVar15;
            local_250 = local_750._0_8_;
            uStack_248 = local_750._8_8_;
            local_240 = local_760._0_8_;
            uStack_238 = local_760._8_8_;
            local_230 = local_770._0_8_;
            uStack_228 = local_770._8_8_;
            local_220 = local_780;
            uStack_218 = uStack_778;
            local_420 = auVar184;
            if ((pGVar104->mask & (local_7f0->super_RayK<1>).mask) != 0) {
              auVar134 = vandps_avx(auVar134,auVar175);
              local_580[0] = auVar134;
              fVar140 = 1.0 / auVar110._0_4_;
              local_1e0[0] = fVar140 * ((float)local_160._0_4_ + 0.0);
              local_1e0[1] = fVar140 * ((float)local_160._4_4_ + 1.0);
              local_1e0[2] = fVar140 * (fStack_158 + 2.0);
              local_1e0[3] = fVar140 * (fStack_154 + 3.0);
              fStack_1d0 = fVar140 * (fStack_150 + 4.0);
              fStack_1cc = fVar140 * (fStack_14c + 5.0);
              fStack_1c8 = fVar140 * (fStack_148 + 6.0);
              fStack_1c4 = fStack_144 + 7.0;
              local_420._0_8_ = auVar166._0_8_;
              local_420._8_8_ = auVar166._8_8_;
              local_1c0 = local_420._0_8_;
              uStack_1b8 = local_420._8_8_;
              uStack_1b0 = 0;
              uStack_1a8 = 0;
              local_1a0 = local_400;
              auVar133._8_4_ = 0x7f800000;
              auVar133._0_8_ = 0x7f8000007f800000;
              auVar133._12_4_ = 0x7f800000;
              auVar133._16_4_ = 0x7f800000;
              auVar133._20_4_ = 0x7f800000;
              auVar133._24_4_ = 0x7f800000;
              auVar133._28_4_ = 0x7f800000;
              auVar184 = vblendvps_avx(auVar133,local_400,auVar134);
              auVar114 = vshufps_avx(auVar184,auVar184,0xb1);
              auVar114 = vminps_avx(auVar184,auVar114);
              auVar131 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar131);
              auVar131 = vpermpd_avx2(auVar114,0x4e);
              auVar114 = vminps_avx(auVar114,auVar131);
              auVar184 = vcmpps_avx(auVar184,auVar114,0);
              auVar114 = auVar134 & auVar184;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar134 = vandps_avx(auVar184,auVar134);
              }
              uVar97 = vmovmskps_avx(auVar134);
              uVar23 = 0;
              for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x80000000) {
                uVar23 = uVar23 + 1;
              }
              uVar99 = (ulong)uVar23;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar104->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_7e0 = ZEXT432((uint)(local_7f0->super_RayK<1>).tfar);
                do {
                  local_684 = local_1e0[uVar99];
                  local_680 = *(undefined4 *)((long)&local_1c0 + uVar99 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar99 * 4);
                  local_730.context = context->user;
                  fVar140 = 1.0 - local_684;
                  auVar166 = ZEXT416((uint)(local_684 * fVar140 * 4.0));
                  auVar6 = vfnmsub213ss_fma(ZEXT416((uint)local_684),ZEXT416((uint)local_684),
                                            auVar166);
                  auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),auVar166)
                  ;
                  fVar140 = fVar140 * -fVar140 * 0.5;
                  fVar119 = auVar6._0_4_ * 0.5;
                  fVar120 = auVar166._0_4_ * 0.5;
                  fVar121 = local_684 * local_684 * 0.5;
                  auVar171._0_4_ = fVar121 * (float)local_780._0_4_;
                  auVar171._4_4_ = fVar121 * (float)local_780._4_4_;
                  auVar171._8_4_ = fVar121 * (float)uStack_778;
                  auVar171._12_4_ = fVar121 * uStack_778._4_4_;
                  auVar151._4_4_ = fVar120;
                  auVar151._0_4_ = fVar120;
                  auVar151._8_4_ = fVar120;
                  auVar151._12_4_ = fVar120;
                  auVar166 = vfmadd132ps_fma(auVar151,auVar171,local_770);
                  auVar172._4_4_ = fVar119;
                  auVar172._0_4_ = fVar119;
                  auVar172._8_4_ = fVar119;
                  auVar172._12_4_ = fVar119;
                  auVar166 = vfmadd132ps_fma(auVar172,auVar166,local_760);
                  auVar152._4_4_ = fVar140;
                  auVar152._0_4_ = fVar140;
                  auVar152._8_4_ = fVar140;
                  auVar152._12_4_ = fVar140;
                  auVar166 = vfmadd132ps_fma(auVar152,auVar166,local_750);
                  local_690 = vmovlps_avx(auVar166);
                  local_688 = vextractps_avx(auVar166,2);
                  local_67c = (int)local_788;
                  local_678 = (int)local_7e8;
                  local_674 = (local_730.context)->instID[0];
                  local_670 = (local_730.context)->instPrimID[0];
                  local_7f4 = -1;
                  local_730.valid = &local_7f4;
                  local_730.geometryUserPtr = pGVar104->userPtr;
                  local_730.ray = (RTCRayN *)ray;
                  local_730.hit = (RTCHitN *)&local_690;
                  local_730.N = 1;
                  if (pGVar104->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018a6d67:
                    p_Var18 = context->args->filter;
                    if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar104->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var18)(&local_730);
                      auVar210 = ZEXT3264(_local_5e0);
                      auVar162 = ZEXT3264(local_5c0);
                      auVar189 = ZEXT3264(local_6c0);
                      auVar139 = ZEXT3264(local_700);
                      auVar207 = ZEXT3264(local_6e0);
                      auVar223 = ZEXT3264(local_620);
                      ray = local_7f0;
                      fVar141 = (float)local_7c0._0_4_;
                      if (*local_730.valid == 0) goto LAB_018a6e39;
                    }
                    (((Vec3f *)((long)local_730.ray + 0x30))->field_0).components[0] =
                         *(float *)local_730.hit;
                    (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_730.hit + 4);
                    (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_730.hit + 8);
                    *(float *)((long)local_730.ray + 0x3c) = *(float *)(local_730.hit + 0xc);
                    *(float *)((long)local_730.ray + 0x40) = *(float *)(local_730.hit + 0x10);
                    *(float *)((long)local_730.ray + 0x44) = *(float *)(local_730.hit + 0x14);
                    *(float *)((long)local_730.ray + 0x48) = *(float *)(local_730.hit + 0x18);
                    *(float *)((long)local_730.ray + 0x4c) = *(float *)(local_730.hit + 0x1c);
                    *(float *)((long)local_730.ray + 0x50) = *(float *)(local_730.hit + 0x20);
                  }
                  else {
                    (*pGVar104->intersectionFilterN)(&local_730);
                    auVar210 = ZEXT3264(_local_5e0);
                    auVar162 = ZEXT3264(local_5c0);
                    auVar189 = ZEXT3264(local_6c0);
                    auVar139 = ZEXT3264(local_700);
                    auVar207 = ZEXT3264(local_6e0);
                    auVar223 = ZEXT3264(local_620);
                    ray = local_7f0;
                    fVar141 = (float)local_7c0._0_4_;
                    if (*local_730.valid != 0) goto LAB_018a6d67;
LAB_018a6e39:
                    (local_7f0->super_RayK<1>).tfar = (float)local_7e0._0_4_;
                    ray = local_7f0;
                  }
                  auVar173 = auVar139._0_32_;
                  auVar188 = auVar189._0_32_;
                  auVar217 = auVar162._0_32_;
                  *(undefined4 *)(local_580[0] + uVar99 * 4) = 0;
                  auVar114 = local_580[0];
                  fVar140 = (ray->super_RayK<1>).tfar;
                  auVar118._4_4_ = fVar140;
                  auVar118._0_4_ = fVar140;
                  auVar118._8_4_ = fVar140;
                  auVar118._12_4_ = fVar140;
                  auVar118._16_4_ = fVar140;
                  auVar118._20_4_ = fVar140;
                  auVar118._24_4_ = fVar140;
                  auVar118._28_4_ = fVar140;
                  auVar184 = vcmpps_avx(local_400,auVar118,2);
                  auVar134 = vandps_avx(auVar184,local_580[0]);
                  local_580[0] = auVar134;
                  auVar114 = auVar114 & auVar184;
                  prim = local_740;
                  if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar114 >> 0x7f,0) == '\0') &&
                        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar114 >> 0xbf,0) == '\0') &&
                      (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar114[0x1f]) goto LAB_018a5cc6;
                  auVar138._8_4_ = 0x7f800000;
                  auVar138._0_8_ = 0x7f8000007f800000;
                  auVar138._12_4_ = 0x7f800000;
                  auVar138._16_4_ = 0x7f800000;
                  auVar138._20_4_ = 0x7f800000;
                  auVar138._24_4_ = 0x7f800000;
                  auVar138._28_4_ = 0x7f800000;
                  auVar184 = vblendvps_avx(auVar138,local_400,auVar134);
                  auVar114 = vshufps_avx(auVar184,auVar184,0xb1);
                  auVar114 = vminps_avx(auVar184,auVar114);
                  auVar131 = vshufpd_avx(auVar114,auVar114,5);
                  auVar114 = vminps_avx(auVar114,auVar131);
                  auVar131 = vpermpd_avx2(auVar114,0x4e);
                  auVar114 = vminps_avx(auVar114,auVar131);
                  auVar184 = vcmpps_avx(auVar184,auVar114,0);
                  auVar114 = auVar134 & auVar184;
                  if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar114 >> 0x7f,0) != '\0') ||
                        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar114 >> 0xbf,0) != '\0') ||
                      (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar114[0x1f] < '\0') {
                    auVar134 = vandps_avx(auVar184,auVar134);
                  }
                  local_7e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  uVar98 = vmovmskps_avx(auVar134);
                  uVar100 = 0;
                  for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                    uVar100 = uVar100 + 1;
                  }
                  uVar99 = (ulong)uVar100;
                } while( true );
              }
              fVar140 = local_1e0[uVar99];
              fVar119 = *(float *)((long)&local_1c0 + uVar99 * 4);
              fVar120 = 1.0 - fVar140;
              auVar166 = ZEXT416((uint)(fVar140 * fVar120 * 4.0));
              auVar6 = vfnmsub213ss_fma(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),auVar166);
              auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),auVar166);
              fVar120 = fVar120 * -fVar120 * 0.5;
              fVar121 = auVar6._0_4_ * 0.5;
              fVar122 = auVar166._0_4_ * 0.5;
              fVar123 = fVar140 * fVar140 * 0.5;
              auVar164._0_4_ = fVar123 * (float)local_780._0_4_;
              auVar164._4_4_ = fVar123 * (float)local_780._4_4_;
              auVar164._8_4_ = fVar123 * (float)uStack_778;
              auVar164._12_4_ = fVar123 * uStack_778._4_4_;
              auVar145._4_4_ = fVar122;
              auVar145._0_4_ = fVar122;
              auVar145._8_4_ = fVar122;
              auVar145._12_4_ = fVar122;
              auVar166 = vfmadd132ps_fma(auVar145,auVar164,local_770);
              auVar165._4_4_ = fVar121;
              auVar165._0_4_ = fVar121;
              auVar165._8_4_ = fVar121;
              auVar165._12_4_ = fVar121;
              auVar166 = vfmadd132ps_fma(auVar165,auVar166,local_760);
              auVar146._4_4_ = fVar120;
              auVar146._0_4_ = fVar120;
              auVar146._8_4_ = fVar120;
              auVar146._12_4_ = fVar120;
              auVar166 = vfmadd132ps_fma(auVar146,auVar166,local_750);
              (local_7f0->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar99 * 4);
              uVar106 = vmovlps_avx(auVar166);
              *(undefined8 *)&(local_7f0->Ng).field_0 = uVar106;
              fVar120 = (float)vextractps_avx(auVar166,2);
              (local_7f0->Ng).field_0.field_0.z = fVar120;
              local_7f0->u = fVar140;
              local_7f0->v = fVar119;
              local_7f0->primID = uVar98;
              local_7f0->geomID = uVar100;
              local_7f0->instID[0] = context->user->instID[0];
              local_7f0->instPrimID[0] = context->user->instPrimID[0];
              prim = local_740;
            }
          }
LAB_018a5cc6:
          auVar139 = ZEXT3264(local_640);
          auVar162 = ZEXT3264(local_5a0);
        }
      }
      if (8 < iVar15) {
        _local_5e0 = auVar210._0_32_;
        local_5c0 = auVar217;
        local_6c0 = auVar188;
        local_700 = auVar173;
        local_3a0 = (float)iVar15;
        fStack_39c = (float)iVar15;
        fStack_398 = (float)iVar15;
        fStack_394 = (float)iVar15;
        fStack_390 = (float)iVar15;
        fStack_38c = (float)iVar15;
        fStack_388 = (float)iVar15;
        iStack_384 = iVar15;
        local_3c0._4_4_ = fVar141;
        local_3c0._0_4_ = fVar141;
        fStack_3b8 = fVar141;
        fStack_3b4 = fVar141;
        fStack_3b0 = fVar141;
        fStack_3ac = fVar141;
        fStack_3a8 = fVar141;
        fStack_3a4 = fVar141;
        auVar166 = vpermilps_avx(local_540._0_16_,0xff);
        local_3e0._8_8_ = auVar166._0_8_;
        local_3e0._0_8_ = local_3e0._8_8_;
        local_3e0._16_8_ = local_3e0._8_8_;
        local_3e0._24_8_ = local_3e0._8_8_;
        local_140 = 1.0 / (float)local_500._0_4_;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        lVar101 = 8;
LAB_018a5db4:
        auVar134 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 * 4 + lVar24);
        local_7c0 = *(undefined1 (*) [32])(lVar24 + 0x21aefac + lVar101 * 4);
        auVar184 = *(undefined1 (*) [32])(lVar24 + 0x21af430 + lVar101 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar24 + 0x21af8b4 + lVar101 * 4);
        auVar95 = *(undefined1 (*) [28])*pauVar2;
        auVar189._0_4_ = local_4a0 * *(float *)*pauVar2;
        auVar189._4_4_ = fStack_49c * *(float *)(*pauVar2 + 4);
        auVar189._8_4_ = fStack_498 * *(float *)(*pauVar2 + 8);
        auVar189._12_4_ = fStack_494 * *(float *)(*pauVar2 + 0xc);
        auVar189._16_4_ = fStack_490 * *(float *)(*pauVar2 + 0x10);
        auVar189._20_4_ = fStack_48c * *(float *)(*pauVar2 + 0x14);
        auVar189._28_36_ = auVar210._28_36_;
        auVar189._24_4_ = fStack_488 * *(float *)(*pauVar2 + 0x18);
        auVar55._4_4_ = local_480._4_4_ * *(float *)(*pauVar2 + 4);
        auVar55._0_4_ = (float)local_480 * *(float *)*pauVar2;
        auVar55._8_4_ = (float)uStack_478 * *(float *)(*pauVar2 + 8);
        auVar55._12_4_ = uStack_478._4_4_ * *(float *)(*pauVar2 + 0xc);
        auVar55._16_4_ = (float)uStack_470 * *(float *)(*pauVar2 + 0x10);
        auVar55._20_4_ = uStack_470._4_4_ * *(float *)(*pauVar2 + 0x14);
        auVar55._24_4_ = (float)uStack_468 * *(float *)(*pauVar2 + 0x18);
        auVar55._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
        auVar166 = vfmadd231ps_fma(auVar189._0_32_,auVar184,auVar139._0_32_);
        auVar6 = vfmadd231ps_fma(auVar55,auVar184,auVar162._0_32_);
        auVar222 = auVar223._0_32_;
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),local_7c0,auVar222);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),local_7c0,local_4e0);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar134,auVar207._0_32_);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar134,local_4c0);
        auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 * 4 + lVar24);
        auVar131 = *(undefined1 (*) [32])(lVar24 + 0x21b13cc + lVar101 * 4);
        auVar202 = *(undefined1 (*) [32])(lVar24 + 0x21b1850 + lVar101 * 4);
        pfVar1 = (float *)(lVar24 + 0x21b1cd4 + lVar101 * 4);
        fVar124 = *pfVar1;
        fVar190 = pfVar1[1];
        fVar87 = pfVar1[2];
        fVar88 = pfVar1[3];
        fVar89 = pfVar1[4];
        fVar90 = pfVar1[5];
        fVar91 = pfVar1[6];
        auVar223._0_4_ = local_4a0 * fVar124;
        auVar223._4_4_ = fStack_49c * fVar190;
        auVar223._8_4_ = fStack_498 * fVar87;
        auVar223._12_4_ = fStack_494 * fVar88;
        auVar223._16_4_ = fStack_490 * fVar89;
        auVar223._20_4_ = fStack_48c * fVar90;
        auVar223._28_36_ = auVar207._28_36_;
        auVar223._24_4_ = fStack_488 * fVar91;
        auVar56._4_4_ = fVar190 * local_480._4_4_;
        auVar56._0_4_ = fVar124 * (float)local_480;
        auVar56._8_4_ = fVar87 * (float)uStack_478;
        auVar56._12_4_ = fVar88 * uStack_478._4_4_;
        auVar56._16_4_ = fVar89 * (float)uStack_470;
        auVar56._20_4_ = fVar90 * uStack_470._4_4_;
        auVar56._24_4_ = fVar91 * (float)uStack_468;
        auVar56._28_4_ = uStack_468._4_4_;
        auVar7 = vfmadd231ps_fma(auVar223._0_32_,auVar202,auVar139._0_32_);
        auVar8 = vfmadd231ps_fma(auVar56,auVar202,auVar162._0_32_);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar131,auVar222);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar131,local_4e0);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar114,auVar207._0_32_);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar114,local_4c0);
        local_300 = ZEXT1632(auVar7);
        local_340 = ZEXT1632(auVar166);
        local_380 = vsubps_avx(local_300,local_340);
        local_520 = ZEXT1632(auVar8);
        local_320 = ZEXT1632(auVar6);
        local_360 = vsubps_avx(local_520,local_320);
        auVar85._4_4_ = auVar6._4_4_ * local_380._4_4_;
        auVar85._0_4_ = auVar6._0_4_ * local_380._0_4_;
        auVar85._8_4_ = auVar6._8_4_ * local_380._8_4_;
        auVar85._12_4_ = auVar6._12_4_ * local_380._12_4_;
        auVar85._16_4_ = local_380._16_4_ * 0.0;
        auVar85._20_4_ = local_380._20_4_ * 0.0;
        auVar85._24_4_ = local_380._24_4_ * 0.0;
        auVar85._28_4_ = local_4e0._28_4_;
        fVar141 = local_360._0_4_;
        auVar207._0_4_ = auVar166._0_4_ * fVar141;
        fVar140 = local_360._4_4_;
        auVar207._4_4_ = auVar166._4_4_ * fVar140;
        fVar119 = local_360._8_4_;
        auVar207._8_4_ = auVar166._8_4_ * fVar119;
        fVar120 = local_360._12_4_;
        auVar207._12_4_ = auVar166._12_4_ * fVar120;
        fVar121 = local_360._16_4_;
        auVar207._16_4_ = fVar121 * 0.0;
        fVar122 = local_360._20_4_;
        auVar207._20_4_ = fVar122 * 0.0;
        fVar123 = local_360._24_4_;
        auVar207._28_36_ = auVar139._28_36_;
        auVar207._24_4_ = fVar123 * 0.0;
        auVar210 = ZEXT3264(*pauVar2);
        auVar116 = vsubps_avx(auVar85,auVar207._0_32_);
        auVar185._0_4_ = auVar95._0_4_ * (float)local_100;
        auVar185._4_4_ = auVar95._4_4_ * local_100._4_4_;
        auVar185._8_4_ = auVar95._8_4_ * (float)uStack_f8;
        auVar185._12_4_ = auVar95._12_4_ * uStack_f8._4_4_;
        auVar185._16_4_ = auVar95._16_4_ * (float)uStack_f0;
        auVar185._20_4_ = auVar95._20_4_ * uStack_f0._4_4_;
        auVar185._24_4_ = auVar95._24_4_ * (float)uStack_e8;
        auVar185._28_4_ = 0;
        auVar166 = vfmadd231ps_fma(auVar185,auVar184,local_e0);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),local_7c0,local_c0);
        auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),local_a0,auVar134);
        auVar57._4_4_ = fVar190 * local_100._4_4_;
        auVar57._0_4_ = fVar124 * (float)local_100;
        auVar57._8_4_ = fVar87 * (float)uStack_f8;
        auVar57._12_4_ = fVar88 * uStack_f8._4_4_;
        auVar57._16_4_ = fVar89 * (float)uStack_f0;
        auVar57._20_4_ = fVar90 * uStack_f0._4_4_;
        auVar57._24_4_ = fVar91 * (float)uStack_e8;
        auVar57._28_4_ = uStack_e8._4_4_;
        auVar6 = vfmadd231ps_fma(auVar57,auVar202,local_e0);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar131,local_c0);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar114,local_a0);
        auVar58._4_4_ = fVar140 * fVar140;
        auVar58._0_4_ = fVar141 * fVar141;
        auVar58._8_4_ = fVar119 * fVar119;
        auVar58._12_4_ = fVar120 * fVar120;
        auVar58._16_4_ = fVar121 * fVar121;
        auVar58._20_4_ = fVar122 * fVar122;
        auVar58._24_4_ = fVar123 * fVar123;
        auVar58._28_4_ = local_360._28_4_;
        auVar7 = vfmadd231ps_fma(auVar58,local_380,local_380);
        auVar195 = vmaxps_avx(ZEXT1632(auVar166),ZEXT1632(auVar6));
        auVar200._0_4_ = auVar195._0_4_ * auVar195._0_4_ * auVar7._0_4_;
        auVar200._4_4_ = auVar195._4_4_ * auVar195._4_4_ * auVar7._4_4_;
        auVar200._8_4_ = auVar195._8_4_ * auVar195._8_4_ * auVar7._8_4_;
        auVar200._12_4_ = auVar195._12_4_ * auVar195._12_4_ * auVar7._12_4_;
        auVar200._16_4_ = auVar195._16_4_ * auVar195._16_4_ * 0.0;
        auVar200._20_4_ = auVar195._20_4_ * auVar195._20_4_ * 0.0;
        auVar200._24_4_ = auVar195._24_4_ * auVar195._24_4_ * 0.0;
        auVar200._28_4_ = 0;
        auVar59._4_4_ = auVar116._4_4_ * auVar116._4_4_;
        auVar59._0_4_ = auVar116._0_4_ * auVar116._0_4_;
        auVar59._8_4_ = auVar116._8_4_ * auVar116._8_4_;
        auVar59._12_4_ = auVar116._12_4_ * auVar116._12_4_;
        auVar59._16_4_ = auVar116._16_4_ * auVar116._16_4_;
        auVar59._20_4_ = auVar116._20_4_ * auVar116._20_4_;
        auVar59._24_4_ = auVar116._24_4_ * auVar116._24_4_;
        auVar59._28_4_ = auVar116._28_4_;
        auVar195 = vcmpps_avx(auVar59,auVar200,2);
        local_260 = (int)lVar101;
        auVar201._4_4_ = local_260;
        auVar201._0_4_ = local_260;
        auVar201._8_4_ = local_260;
        auVar201._12_4_ = local_260;
        auVar201._16_4_ = local_260;
        auVar201._20_4_ = local_260;
        auVar201._24_4_ = local_260;
        auVar201._28_4_ = local_260;
        auVar116 = vpor_avx2(auVar201,_DAT_01fe9900);
        auVar94._4_4_ = fStack_39c;
        auVar94._0_4_ = local_3a0;
        auVar94._8_4_ = fStack_398;
        auVar94._12_4_ = fStack_394;
        auVar94._16_4_ = fStack_390;
        auVar94._20_4_ = fStack_38c;
        auVar94._24_4_ = fStack_388;
        auVar94._28_4_ = iStack_384;
        auVar19 = vpcmpgtd_avx2(auVar94,auVar116);
        auVar116 = auVar19 & auVar195;
        if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar116 >> 0x7f,0) == '\0') &&
              (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar116 >> 0xbf,0) == '\0') &&
            (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar116[0x1f]) {
          auVar223 = ZEXT3264(auVar222);
          auVar207 = ZEXT3264(local_6e0);
        }
        else {
          local_500 = vandps_avx(auVar19,auVar195);
          auVar60._4_4_ = (float)local_5e0._4_4_ * fVar190;
          auVar60._0_4_ = (float)local_5e0._0_4_ * fVar124;
          auVar60._8_4_ = fStack_5d8 * fVar87;
          auVar60._12_4_ = fStack_5d4 * fVar88;
          auVar60._16_4_ = fStack_5d0 * fVar89;
          auVar60._20_4_ = fStack_5cc * fVar90;
          auVar60._24_4_ = fStack_5c8 * fVar91;
          auVar60._28_4_ = auVar195._28_4_;
          auVar7 = vfmadd213ps_fma(auVar202,local_5c0,auVar60);
          auVar7 = vfmadd213ps_fma(auVar131,local_6c0,ZEXT1632(auVar7));
          auVar7 = vfmadd132ps_fma(auVar114,ZEXT1632(auVar7),local_700);
          auVar61._4_4_ = (float)local_5e0._4_4_ * auVar95._4_4_;
          auVar61._0_4_ = (float)local_5e0._0_4_ * auVar95._0_4_;
          auVar61._8_4_ = fStack_5d8 * auVar95._8_4_;
          auVar61._12_4_ = fStack_5d4 * auVar95._12_4_;
          auVar61._16_4_ = fStack_5d0 * auVar95._16_4_;
          auVar61._20_4_ = fStack_5cc * auVar95._20_4_;
          auVar61._24_4_ = fStack_5c8 * auVar95._24_4_;
          auVar61._28_4_ = auVar195._28_4_;
          auVar8 = vfmadd213ps_fma(auVar184,local_5c0,auVar61);
          auVar8 = vfmadd213ps_fma(local_7c0,local_6c0,ZEXT1632(auVar8));
          auVar184 = *(undefined1 (*) [32])(lVar24 + 0x21afd38 + lVar101 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar24 + 0x21b01bc + lVar101 * 4);
          auVar131 = *(undefined1 (*) [32])(lVar24 + 0x21b0640 + lVar101 * 4);
          pfVar1 = (float *)(lVar24 + 0x21b0ac4 + lVar101 * 4);
          fVar141 = *pfVar1;
          fVar140 = pfVar1[1];
          fVar119 = pfVar1[2];
          fVar120 = pfVar1[3];
          fVar121 = pfVar1[4];
          fVar122 = pfVar1[5];
          fVar123 = pfVar1[6];
          auVar196._0_4_ = local_4a0 * fVar141;
          auVar196._4_4_ = fStack_49c * fVar140;
          auVar196._8_4_ = fStack_498 * fVar119;
          auVar196._12_4_ = fStack_494 * fVar120;
          auVar196._16_4_ = fStack_490 * fVar121;
          auVar196._20_4_ = fStack_48c * fVar122;
          auVar196._24_4_ = fStack_488 * fVar123;
          auVar196._28_4_ = 0;
          auVar62._4_4_ = fVar140 * local_480._4_4_;
          auVar62._0_4_ = fVar141 * (float)local_480;
          auVar62._8_4_ = fVar119 * (float)uStack_478;
          auVar62._12_4_ = fVar120 * uStack_478._4_4_;
          auVar62._16_4_ = fVar121 * (float)uStack_470;
          auVar62._20_4_ = fVar122 * uStack_470._4_4_;
          auVar62._24_4_ = fVar123 * (float)uStack_468;
          auVar62._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
          auVar63._4_4_ = (float)local_5e0._4_4_ * fVar140;
          auVar63._0_4_ = (float)local_5e0._0_4_ * fVar141;
          auVar63._8_4_ = fStack_5d8 * fVar119;
          auVar63._12_4_ = fStack_5d4 * fVar120;
          auVar63._16_4_ = fStack_5d0 * fVar121;
          auVar63._20_4_ = fStack_5cc * fVar122;
          auVar63._24_4_ = fStack_5c8 * fVar123;
          auVar63._28_4_ = pfVar1[7];
          auVar9 = vfmadd231ps_fma(auVar196,auVar131,local_640);
          auVar10 = vfmadd231ps_fma(auVar62,auVar131,local_5a0);
          auVar11 = vfmadd231ps_fma(auVar63,local_5c0,auVar131);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar114,auVar222);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar114,local_4e0);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_6c0,auVar114);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar184,local_6e0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar184,local_4c0);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar184,local_700);
          pfVar1 = (float *)(lVar24 + 0x21b2ee4 + lVar101 * 4);
          fVar141 = *pfVar1;
          fVar140 = pfVar1[1];
          fVar119 = pfVar1[2];
          fVar120 = pfVar1[3];
          fVar121 = pfVar1[4];
          fVar122 = pfVar1[5];
          fVar123 = pfVar1[6];
          auVar64._4_4_ = fStack_49c * fVar140;
          auVar64._0_4_ = local_4a0 * fVar141;
          auVar64._8_4_ = fStack_498 * fVar119;
          auVar64._12_4_ = fStack_494 * fVar120;
          auVar64._16_4_ = fStack_490 * fVar121;
          auVar64._20_4_ = fStack_48c * fVar122;
          auVar64._24_4_ = fStack_488 * fVar123;
          auVar64._28_4_ = fStack_484;
          auVar65._4_4_ = local_480._4_4_ * fVar140;
          auVar65._0_4_ = (float)local_480 * fVar141;
          auVar65._8_4_ = (float)uStack_478 * fVar119;
          auVar65._12_4_ = uStack_478._4_4_ * fVar120;
          auVar65._16_4_ = (float)uStack_470 * fVar121;
          auVar65._20_4_ = uStack_470._4_4_ * fVar122;
          auVar65._24_4_ = (float)uStack_468 * fVar123;
          auVar65._28_4_ = uStack_5c4;
          auVar66._4_4_ = fVar140 * (float)local_5e0._4_4_;
          auVar66._0_4_ = fVar141 * (float)local_5e0._0_4_;
          auVar66._8_4_ = fVar119 * fStack_5d8;
          auVar66._12_4_ = fVar120 * fStack_5d4;
          auVar66._16_4_ = fVar121 * fStack_5d0;
          auVar66._20_4_ = fVar122 * fStack_5cc;
          auVar66._24_4_ = fVar123 * fStack_5c8;
          auVar66._28_4_ = pfVar1[7];
          auVar184 = *(undefined1 (*) [32])(lVar24 + 0x21b2a60 + lVar101 * 4);
          auVar12 = vfmadd231ps_fma(auVar64,auVar184,local_640);
          auVar13 = vfmadd231ps_fma(auVar65,auVar184,local_5a0);
          auVar107 = vfmadd231ps_fma(auVar66,auVar184,local_5c0);
          auVar184 = *(undefined1 (*) [32])(lVar24 + 0x21b25dc + lVar101 * 4);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar184,local_620);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar184,local_4e0);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar184,local_6c0);
          auVar184 = *(undefined1 (*) [32])(lVar24 + 0x21b2158 + lVar101 * 4);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar184,local_6e0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar184,local_4c0);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_700,auVar184);
          auVar184 = vandps_avx(ZEXT1632(auVar9),local_180);
          auVar114 = vandps_avx(ZEXT1632(auVar10),local_180);
          auVar114 = vmaxps_avx(auVar184,auVar114);
          auVar184 = vandps_avx(ZEXT1632(auVar11),local_180);
          auVar184 = vmaxps_avx(auVar114,auVar184);
          auVar184 = vcmpps_avx(auVar184,_local_3c0,1);
          auVar131 = vblendvps_avx(ZEXT1632(auVar9),local_380,auVar184);
          auVar202 = vblendvps_avx(ZEXT1632(auVar10),local_360,auVar184);
          auVar184 = vandps_avx(ZEXT1632(auVar12),local_180);
          auVar114 = vandps_avx(ZEXT1632(auVar13),local_180);
          auVar114 = vmaxps_avx(auVar184,auVar114);
          auVar184 = vandps_avx(local_180,ZEXT1632(auVar107));
          auVar184 = vmaxps_avx(auVar114,auVar184);
          auVar114 = vcmpps_avx(auVar184,_local_3c0,1);
          auVar184 = vblendvps_avx(ZEXT1632(auVar12),local_380,auVar114);
          auVar114 = vblendvps_avx(ZEXT1632(auVar13),local_360,auVar114);
          auVar8 = vfmadd213ps_fma(auVar134,local_700,ZEXT1632(auVar8));
          auVar9 = vfmadd213ps_fma(auVar131,auVar131,ZEXT832(0) << 0x20);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar202,auVar202);
          auVar134 = vrsqrtps_avx(ZEXT1632(auVar9));
          fVar141 = auVar134._0_4_;
          fVar140 = auVar134._4_4_;
          fVar119 = auVar134._8_4_;
          fVar120 = auVar134._12_4_;
          fVar121 = auVar134._16_4_;
          fVar122 = auVar134._20_4_;
          fVar123 = auVar134._24_4_;
          auVar67._4_4_ = fVar140 * fVar140 * fVar140 * auVar9._4_4_ * -0.5;
          auVar67._0_4_ = fVar141 * fVar141 * fVar141 * auVar9._0_4_ * -0.5;
          auVar67._8_4_ = fVar119 * fVar119 * fVar119 * auVar9._8_4_ * -0.5;
          auVar67._12_4_ = fVar120 * fVar120 * fVar120 * auVar9._12_4_ * -0.5;
          auVar67._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
          auVar67._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
          auVar67._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
          auVar67._28_4_ = 0;
          auVar218._8_4_ = 0x3fc00000;
          auVar218._0_8_ = 0x3fc000003fc00000;
          auVar218._12_4_ = 0x3fc00000;
          auVar218._16_4_ = 0x3fc00000;
          auVar218._20_4_ = 0x3fc00000;
          auVar218._24_4_ = 0x3fc00000;
          auVar218._28_4_ = 0x3fc00000;
          auVar9 = vfmadd231ps_fma(auVar67,auVar218,auVar134);
          fVar141 = auVar9._0_4_;
          fVar140 = auVar9._4_4_;
          auVar68._4_4_ = auVar202._4_4_ * fVar140;
          auVar68._0_4_ = auVar202._0_4_ * fVar141;
          fVar119 = auVar9._8_4_;
          auVar68._8_4_ = auVar202._8_4_ * fVar119;
          fVar120 = auVar9._12_4_;
          auVar68._12_4_ = auVar202._12_4_ * fVar120;
          auVar68._16_4_ = auVar202._16_4_ * 0.0;
          auVar68._20_4_ = auVar202._20_4_ * 0.0;
          auVar68._24_4_ = auVar202._24_4_ * 0.0;
          auVar68._28_4_ = auVar202._28_4_;
          auVar69._4_4_ = fVar140 * -auVar131._4_4_;
          auVar69._0_4_ = fVar141 * -auVar131._0_4_;
          auVar69._8_4_ = fVar119 * -auVar131._8_4_;
          auVar69._12_4_ = fVar120 * -auVar131._12_4_;
          auVar69._16_4_ = -auVar131._16_4_ * 0.0;
          auVar69._20_4_ = -auVar131._20_4_ * 0.0;
          auVar69._24_4_ = -auVar131._24_4_ * 0.0;
          auVar69._28_4_ = auVar134._28_4_;
          auVar9 = vfmadd213ps_fma(auVar184,auVar184,ZEXT832(0) << 0x20);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar114,auVar114);
          auVar134 = vrsqrtps_avx(ZEXT1632(auVar9));
          auVar70._28_4_ = local_380._28_4_;
          auVar70._0_28_ =
               ZEXT1628(CONCAT412(fVar120 * 0.0,
                                  CONCAT48(fVar119 * 0.0,CONCAT44(fVar140 * 0.0,fVar141 * 0.0))));
          fVar141 = auVar134._0_4_;
          fVar140 = auVar134._4_4_;
          fVar119 = auVar134._8_4_;
          fVar120 = auVar134._12_4_;
          fVar121 = auVar134._16_4_;
          fVar122 = auVar134._20_4_;
          fVar123 = auVar134._24_4_;
          auVar71._4_4_ = fVar140 * fVar140 * fVar140 * auVar9._4_4_ * -0.5;
          auVar71._0_4_ = fVar141 * fVar141 * fVar141 * auVar9._0_4_ * -0.5;
          auVar71._8_4_ = fVar119 * fVar119 * fVar119 * auVar9._8_4_ * -0.5;
          auVar71._12_4_ = fVar120 * fVar120 * fVar120 * auVar9._12_4_ * -0.5;
          auVar71._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
          auVar71._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
          auVar71._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
          auVar71._28_4_ = 0;
          auVar9 = vfmadd231ps_fma(auVar71,auVar218,auVar134);
          fVar141 = auVar9._0_4_;
          fVar140 = auVar9._4_4_;
          auVar72._4_4_ = auVar114._4_4_ * fVar140;
          auVar72._0_4_ = auVar114._0_4_ * fVar141;
          fVar119 = auVar9._8_4_;
          auVar72._8_4_ = auVar114._8_4_ * fVar119;
          fVar120 = auVar9._12_4_;
          auVar72._12_4_ = auVar114._12_4_ * fVar120;
          auVar72._16_4_ = auVar114._16_4_ * 0.0;
          auVar72._20_4_ = auVar114._20_4_ * 0.0;
          auVar72._24_4_ = auVar114._24_4_ * 0.0;
          auVar72._28_4_ = 0;
          auVar73._4_4_ = fVar140 * -auVar184._4_4_;
          auVar73._0_4_ = fVar141 * -auVar184._0_4_;
          auVar73._8_4_ = fVar119 * -auVar184._8_4_;
          auVar73._12_4_ = fVar120 * -auVar184._12_4_;
          auVar73._16_4_ = -auVar184._16_4_ * 0.0;
          auVar73._20_4_ = -auVar184._20_4_ * 0.0;
          auVar73._24_4_ = -auVar184._24_4_ * 0.0;
          auVar73._28_4_ = auVar134._28_4_;
          auVar74._28_4_ = 0xbf000000;
          auVar74._0_28_ =
               ZEXT1628(CONCAT412(fVar120 * 0.0,
                                  CONCAT48(fVar119 * 0.0,CONCAT44(fVar140 * 0.0,fVar141 * 0.0))));
          auVar9 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar166),local_340);
          auVar134 = ZEXT1632(auVar166);
          auVar10 = vfmadd213ps_fma(auVar69,auVar134,local_320);
          auVar11 = vfmadd213ps_fma(auVar70,auVar134,ZEXT1632(auVar8));
          auVar107 = vfnmadd213ps_fma(auVar68,auVar134,local_340);
          auVar12 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar6),local_300);
          auVar142 = vfnmadd213ps_fma(auVar69,auVar134,local_320);
          auVar134 = ZEXT1632(auVar6);
          auVar13 = vfmadd213ps_fma(auVar73,auVar134,local_520);
          local_7e0 = ZEXT1632(auVar166);
          auVar166 = vfnmadd231ps_fma(ZEXT1632(auVar8),local_7e0,auVar70);
          auVar8 = vfmadd213ps_fma(auVar74,auVar134,ZEXT1632(auVar7));
          auVar25 = vfnmadd213ps_fma(auVar72,auVar134,local_300);
          auVar108 = vfnmadd213ps_fma(auVar73,auVar134,local_520);
          auVar143 = vfnmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar6),auVar74);
          local_540 = ZEXT1632(auVar143);
          auVar134 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar142));
          auVar184 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar166));
          auVar186._0_4_ = auVar134._0_4_ * auVar166._0_4_;
          auVar186._4_4_ = auVar134._4_4_ * auVar166._4_4_;
          auVar186._8_4_ = auVar134._8_4_ * auVar166._8_4_;
          auVar186._12_4_ = auVar134._12_4_ * auVar166._12_4_;
          auVar186._16_4_ = auVar134._16_4_ * 0.0;
          auVar186._20_4_ = auVar134._20_4_ * 0.0;
          auVar186._24_4_ = auVar134._24_4_ * 0.0;
          auVar186._28_4_ = 0;
          auVar7 = vfmsub231ps_fma(auVar186,ZEXT1632(auVar142),auVar184);
          auVar75._4_4_ = auVar107._4_4_ * auVar184._4_4_;
          auVar75._0_4_ = auVar107._0_4_ * auVar184._0_4_;
          auVar75._8_4_ = auVar107._8_4_ * auVar184._8_4_;
          auVar75._12_4_ = auVar107._12_4_ * auVar184._12_4_;
          auVar75._16_4_ = auVar184._16_4_ * 0.0;
          auVar75._20_4_ = auVar184._20_4_ * 0.0;
          auVar75._24_4_ = auVar184._24_4_ * 0.0;
          auVar75._28_4_ = auVar184._28_4_;
          auVar202 = ZEXT1632(auVar107);
          auVar184 = vsubps_avx(ZEXT1632(auVar12),auVar202);
          auVar116 = ZEXT1632(auVar166);
          auVar166 = vfmsub231ps_fma(auVar75,auVar116,auVar184);
          auVar76._4_4_ = auVar142._4_4_ * auVar184._4_4_;
          auVar76._0_4_ = auVar142._0_4_ * auVar184._0_4_;
          auVar76._8_4_ = auVar142._8_4_ * auVar184._8_4_;
          auVar76._12_4_ = auVar142._12_4_ * auVar184._12_4_;
          auVar76._16_4_ = auVar184._16_4_ * 0.0;
          auVar76._20_4_ = auVar184._20_4_ * 0.0;
          auVar76._24_4_ = auVar184._24_4_ * 0.0;
          auVar76._28_4_ = auVar184._28_4_;
          auVar107 = vfmsub231ps_fma(auVar76,auVar202,auVar134);
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar166));
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
          auVar19 = vcmpps_avx(ZEXT1632(auVar166),ZEXT832(0) << 0x20,2);
          local_660 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar9),auVar19);
          local_600 = vblendvps_avx(ZEXT1632(auVar108),ZEXT1632(auVar10),auVar19);
          auVar134 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar11),auVar19);
          auVar184 = vblendvps_avx(auVar202,ZEXT1632(auVar12),auVar19);
          auVar114 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar13),auVar19);
          auVar131 = vblendvps_avx(auVar116,ZEXT1632(auVar8),auVar19);
          auVar202 = vblendvps_avx(ZEXT1632(auVar12),auVar202,auVar19);
          auVar195 = vblendvps_avx(ZEXT1632(auVar13),ZEXT1632(auVar142),auVar19);
          auVar166 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
          local_7c0 = ZEXT1632(auVar166);
          auVar116 = vblendvps_avx(ZEXT1632(auVar8),auVar116,auVar19);
          auVar202 = vsubps_avx(auVar202,local_660);
          auVar195 = vsubps_avx(auVar195,local_600);
          auVar222 = vsubps_avx(auVar116,auVar134);
          auVar22 = vsubps_avx(local_660,auVar184);
          auVar20 = vsubps_avx(local_600,auVar114);
          auVar21 = vsubps_avx(auVar134,auVar131);
          auVar179._0_4_ = auVar222._0_4_ * local_660._0_4_;
          auVar179._4_4_ = auVar222._4_4_ * local_660._4_4_;
          auVar179._8_4_ = auVar222._8_4_ * local_660._8_4_;
          auVar179._12_4_ = auVar222._12_4_ * local_660._12_4_;
          auVar179._16_4_ = auVar222._16_4_ * local_660._16_4_;
          auVar179._20_4_ = auVar222._20_4_ * local_660._20_4_;
          auVar179._24_4_ = auVar222._24_4_ * local_660._24_4_;
          auVar179._28_4_ = 0;
          auVar7 = vfmsub231ps_fma(auVar179,auVar134,auVar202);
          auVar77._4_4_ = auVar202._4_4_ * local_600._4_4_;
          auVar77._0_4_ = auVar202._0_4_ * local_600._0_4_;
          auVar77._8_4_ = auVar202._8_4_ * local_600._8_4_;
          auVar77._12_4_ = auVar202._12_4_ * local_600._12_4_;
          auVar77._16_4_ = auVar202._16_4_ * local_600._16_4_;
          auVar77._20_4_ = auVar202._20_4_ * local_600._20_4_;
          auVar77._24_4_ = auVar202._24_4_ * local_600._24_4_;
          auVar77._28_4_ = auVar116._28_4_;
          auVar8 = vfmsub231ps_fma(auVar77,local_660,auVar195);
          auVar210 = ZEXT864(0) << 0x20;
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
          auVar180._0_4_ = auVar195._0_4_ * auVar134._0_4_;
          auVar180._4_4_ = auVar195._4_4_ * auVar134._4_4_;
          auVar180._8_4_ = auVar195._8_4_ * auVar134._8_4_;
          auVar180._12_4_ = auVar195._12_4_ * auVar134._12_4_;
          auVar180._16_4_ = auVar195._16_4_ * auVar134._16_4_;
          auVar180._20_4_ = auVar195._20_4_ * auVar134._20_4_;
          auVar180._24_4_ = auVar195._24_4_ * auVar134._24_4_;
          auVar180._28_4_ = 0;
          auVar8 = vfmsub231ps_fma(auVar180,local_600,auVar222);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
          auVar181._0_4_ = auVar21._0_4_ * auVar184._0_4_;
          auVar181._4_4_ = auVar21._4_4_ * auVar184._4_4_;
          auVar181._8_4_ = auVar21._8_4_ * auVar184._8_4_;
          auVar181._12_4_ = auVar21._12_4_ * auVar184._12_4_;
          auVar181._16_4_ = auVar21._16_4_ * auVar184._16_4_;
          auVar181._20_4_ = auVar21._20_4_ * auVar184._20_4_;
          auVar181._24_4_ = auVar21._24_4_ * auVar184._24_4_;
          auVar181._28_4_ = 0;
          auVar7 = vfmsub231ps_fma(auVar181,auVar22,auVar131);
          auVar78._4_4_ = auVar20._4_4_ * auVar131._4_4_;
          auVar78._0_4_ = auVar20._0_4_ * auVar131._0_4_;
          auVar78._8_4_ = auVar20._8_4_ * auVar131._8_4_;
          auVar78._12_4_ = auVar20._12_4_ * auVar131._12_4_;
          auVar78._16_4_ = auVar20._16_4_ * auVar131._16_4_;
          auVar78._20_4_ = auVar20._20_4_ * auVar131._20_4_;
          auVar78._24_4_ = auVar20._24_4_ * auVar131._24_4_;
          auVar78._28_4_ = auVar131._28_4_;
          auVar9 = vfmsub231ps_fma(auVar78,auVar114,auVar21);
          auVar79._4_4_ = auVar22._4_4_ * auVar114._4_4_;
          auVar79._0_4_ = auVar22._0_4_ * auVar114._0_4_;
          auVar79._8_4_ = auVar22._8_4_ * auVar114._8_4_;
          auVar79._12_4_ = auVar22._12_4_ * auVar114._12_4_;
          auVar79._16_4_ = auVar22._16_4_ * auVar114._16_4_;
          auVar79._20_4_ = auVar22._20_4_ * auVar114._20_4_;
          auVar79._24_4_ = auVar22._24_4_ * auVar114._24_4_;
          auVar79._28_4_ = auVar114._28_4_;
          auVar10 = vfmsub231ps_fma(auVar79,auVar20,auVar184);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
          auVar184 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
          auVar184 = vcmpps_avx(auVar184,ZEXT832(0) << 0x20,2);
          auVar7 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
          auVar7 = vpand_avx(auVar7,auVar166);
          auVar184 = vpmovsxwd_avx2(auVar7);
          if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar184 >> 0x7f,0) == '\0') &&
                (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar184 >> 0xbf,0) == '\0') &&
              (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar184[0x1f]) {
LAB_018a6851:
            auVar161._8_8_ = local_580[1]._8_8_;
            auVar161._0_8_ = local_580[1]._0_8_;
            auVar161._16_8_ = local_580[1]._16_8_;
            auVar161._24_8_ = local_580[1]._24_8_;
          }
          else {
            auVar80._4_4_ = auVar195._4_4_ * auVar21._4_4_;
            auVar80._0_4_ = auVar195._0_4_ * auVar21._0_4_;
            auVar80._8_4_ = auVar195._8_4_ * auVar21._8_4_;
            auVar80._12_4_ = auVar195._12_4_ * auVar21._12_4_;
            auVar80._16_4_ = auVar195._16_4_ * auVar21._16_4_;
            auVar80._20_4_ = auVar195._20_4_ * auVar21._20_4_;
            auVar80._24_4_ = auVar195._24_4_ * auVar21._24_4_;
            auVar80._28_4_ = auVar184._28_4_;
            auVar13 = vfmsub231ps_fma(auVar80,auVar20,auVar222);
            auVar187._0_4_ = auVar22._0_4_ * auVar222._0_4_;
            auVar187._4_4_ = auVar22._4_4_ * auVar222._4_4_;
            auVar187._8_4_ = auVar22._8_4_ * auVar222._8_4_;
            auVar187._12_4_ = auVar22._12_4_ * auVar222._12_4_;
            auVar187._16_4_ = auVar22._16_4_ * auVar222._16_4_;
            auVar187._20_4_ = auVar22._20_4_ * auVar222._20_4_;
            auVar187._24_4_ = auVar22._24_4_ * auVar222._24_4_;
            auVar187._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar187,auVar202,auVar21);
            auVar81._4_4_ = auVar202._4_4_ * auVar20._4_4_;
            auVar81._0_4_ = auVar202._0_4_ * auVar20._0_4_;
            auVar81._8_4_ = auVar202._8_4_ * auVar20._8_4_;
            auVar81._12_4_ = auVar202._12_4_ * auVar20._12_4_;
            auVar81._16_4_ = auVar202._16_4_ * auVar20._16_4_;
            auVar81._20_4_ = auVar202._20_4_ * auVar20._20_4_;
            auVar81._24_4_ = auVar202._24_4_ * auVar20._24_4_;
            auVar81._28_4_ = auVar20._28_4_;
            auVar107 = vfmsub231ps_fma(auVar81,auVar22,auVar195);
            auVar10 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar107));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar13),ZEXT832(0) << 0x20);
            auVar184 = vrcpps_avx(ZEXT1632(auVar11));
            auVar209._8_4_ = 0x3f800000;
            auVar209._0_8_ = 0x3f8000003f800000;
            auVar209._12_4_ = 0x3f800000;
            auVar209._16_4_ = 0x3f800000;
            auVar209._20_4_ = 0x3f800000;
            auVar209._24_4_ = 0x3f800000;
            auVar209._28_4_ = 0x3f800000;
            auVar210 = ZEXT3264(auVar209);
            auVar10 = vfnmadd213ps_fma(auVar184,ZEXT1632(auVar11),auVar209);
            auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar184,auVar184);
            auVar82._4_4_ = auVar107._4_4_ * auVar134._4_4_;
            auVar82._0_4_ = auVar107._0_4_ * auVar134._0_4_;
            auVar82._8_4_ = auVar107._8_4_ * auVar134._8_4_;
            auVar82._12_4_ = auVar107._12_4_ * auVar134._12_4_;
            auVar82._16_4_ = auVar134._16_4_ * 0.0;
            auVar82._20_4_ = auVar134._20_4_ * 0.0;
            auVar82._24_4_ = auVar134._24_4_ * 0.0;
            auVar82._28_4_ = auVar134._28_4_;
            auVar12 = vfmadd231ps_fma(auVar82,ZEXT1632(auVar12),local_600);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar13),local_660);
            fVar140 = auVar10._0_4_;
            fVar119 = auVar10._4_4_;
            fVar120 = auVar10._8_4_;
            fVar121 = auVar10._12_4_;
            auVar114 = ZEXT1632(CONCAT412(fVar121 * auVar12._12_4_,
                                          CONCAT48(fVar120 * auVar12._8_4_,
                                                   CONCAT44(fVar119 * auVar12._4_4_,
                                                            fVar140 * auVar12._0_4_))));
            fVar141 = (ray->super_RayK<1>).tfar;
            auVar160._4_4_ = fVar141;
            auVar160._0_4_ = fVar141;
            auVar160._8_4_ = fVar141;
            auVar160._12_4_ = fVar141;
            auVar160._16_4_ = fVar141;
            auVar160._20_4_ = fVar141;
            auVar160._24_4_ = fVar141;
            auVar160._28_4_ = fVar141;
            auVar134 = vcmpps_avx(local_3e0,auVar114,2);
            auVar184 = vcmpps_avx(auVar114,auVar160,2);
            auVar134 = vandps_avx(auVar184,auVar134);
            auVar10 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
            auVar7 = vpand_avx(auVar7,auVar10);
            auVar134 = vpmovsxwd_avx2(auVar7);
            if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar134 >> 0x7f,0) == '\0') &&
                  (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar134 >> 0xbf,0) == '\0') &&
                (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar134[0x1f]) goto LAB_018a6851;
            auVar134 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,4);
            auVar10 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
            auVar7 = vpand_avx(auVar7,auVar10);
            auVar134 = vpmovsxwd_avx2(auVar7);
            auVar161._8_8_ = local_580[1]._8_8_;
            auVar161._0_8_ = local_580[1]._0_8_;
            auVar161._16_8_ = local_580[1]._16_8_;
            auVar161._24_8_ = local_580[1]._24_8_;
            if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0x7f,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0xbf,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar134[0x1f] < '\0') {
              auVar131 = ZEXT1632(CONCAT412(fVar121 * auVar8._12_4_,
                                            CONCAT48(fVar120 * auVar8._8_4_,
                                                     CONCAT44(fVar119 * auVar8._4_4_,
                                                              fVar140 * auVar8._0_4_))));
              auVar83._28_4_ = SUB84(local_580[1]._24_8_,4);
              auVar83._0_28_ =
                   ZEXT1628(CONCAT412(fVar121 * auVar9._12_4_,
                                      CONCAT48(fVar120 * auVar9._8_4_,
                                               CONCAT44(fVar119 * auVar9._4_4_,
                                                        fVar140 * auVar9._0_4_))));
              auVar197._8_4_ = 0x3f800000;
              auVar197._0_8_ = 0x3f8000003f800000;
              auVar197._12_4_ = 0x3f800000;
              auVar197._16_4_ = 0x3f800000;
              auVar197._20_4_ = 0x3f800000;
              auVar197._24_4_ = 0x3f800000;
              auVar197._28_4_ = 0x3f800000;
              auVar184 = vsubps_avx(auVar197,auVar131);
              local_120 = vblendvps_avx(auVar184,auVar131,auVar19);
              auVar184 = vsubps_avx(auVar197,auVar83);
              local_460 = vblendvps_avx(auVar184,auVar83,auVar19);
              local_440 = auVar114;
              auVar161 = auVar134;
            }
          }
          auVar207 = ZEXT3264(local_6e0);
          auVar223 = ZEXT3264(local_620);
          if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar161 >> 0x7f,0) != '\0') ||
                (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar161 >> 0xbf,0) != '\0') ||
              (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar161[0x1f] < '\0') {
            auVar134 = vsubps_avx(ZEXT1632(auVar6),local_7e0);
            auVar6 = vfmadd213ps_fma(auVar134,local_120,local_7e0);
            fVar141 = local_738->depth_scale;
            auVar84._4_4_ = (auVar6._4_4_ + auVar6._4_4_) * fVar141;
            auVar84._0_4_ = (auVar6._0_4_ + auVar6._0_4_) * fVar141;
            auVar84._8_4_ = (auVar6._8_4_ + auVar6._8_4_) * fVar141;
            auVar84._12_4_ = (auVar6._12_4_ + auVar6._12_4_) * fVar141;
            auVar84._16_4_ = fVar141 * 0.0;
            auVar84._20_4_ = fVar141 * 0.0;
            auVar84._24_4_ = fVar141 * 0.0;
            auVar84._28_4_ = fVar141;
            auVar134 = vcmpps_avx(local_440,auVar84,6);
            auVar184 = auVar161 & auVar134;
            if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar184 >> 0x7f,0) != '\0') ||
                  (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar184 >> 0xbf,0) != '\0') ||
                (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar184[0x1f] < '\0') {
              auVar135._8_4_ = 0xbf800000;
              auVar135._0_8_ = 0xbf800000bf800000;
              auVar135._12_4_ = 0xbf800000;
              auVar135._16_4_ = 0xbf800000;
              auVar135._20_4_ = 0xbf800000;
              auVar135._24_4_ = 0xbf800000;
              auVar135._28_4_ = 0xbf800000;
              auVar157._8_4_ = 0x40000000;
              auVar157._0_8_ = 0x4000000040000000;
              auVar157._12_4_ = 0x40000000;
              auVar157._16_4_ = 0x40000000;
              auVar157._20_4_ = 0x40000000;
              auVar157._24_4_ = 0x40000000;
              auVar157._28_4_ = 0x40000000;
              auVar6 = vfmadd213ps_fma(local_460,auVar157,auVar135);
              local_2c0 = local_120;
              local_460 = ZEXT1632(auVar6);
              auVar184 = local_460;
              local_2a0 = ZEXT1632(auVar6);
              local_280 = local_440;
              local_25c = iVar15;
              local_250 = local_750._0_8_;
              uStack_248 = local_750._8_8_;
              local_240 = local_760._0_8_;
              uStack_238 = local_760._8_8_;
              local_230 = local_770._0_8_;
              uStack_228 = local_770._8_8_;
              local_220 = local_780;
              uStack_218 = uStack_778;
              pGVar104 = (context->scene->geometries).items[local_7e8].ptr;
              local_460 = auVar184;
              if ((pGVar104->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar134 = vandps_avx(auVar134,auVar161);
                local_580[0] = auVar134;
                fVar141 = (float)local_260;
                local_1e0[0] = (fVar141 + local_120._0_4_ + 0.0) * local_140;
                local_1e0[1] = (fVar141 + local_120._4_4_ + 1.0) * fStack_13c;
                local_1e0[2] = (fVar141 + local_120._8_4_ + 2.0) * fStack_138;
                local_1e0[3] = (fVar141 + local_120._12_4_ + 3.0) * fStack_134;
                fStack_1d0 = (fVar141 + local_120._16_4_ + 4.0) * fStack_130;
                fStack_1cc = (fVar141 + local_120._20_4_ + 5.0) * fStack_12c;
                fStack_1c8 = (fVar141 + local_120._24_4_ + 6.0) * fStack_128;
                fStack_1c4 = fVar141 + local_120._28_4_ + 7.0;
                local_460._0_8_ = auVar6._0_8_;
                local_460._8_8_ = auVar6._8_8_;
                local_1c0 = local_460._0_8_;
                uStack_1b8 = local_460._8_8_;
                uStack_1b0 = 0;
                uStack_1a8 = 0;
                local_1a0 = local_440;
                auVar136._8_4_ = 0x7f800000;
                auVar136._0_8_ = 0x7f8000007f800000;
                auVar136._12_4_ = 0x7f800000;
                auVar136._16_4_ = 0x7f800000;
                auVar136._20_4_ = 0x7f800000;
                auVar136._24_4_ = 0x7f800000;
                auVar136._28_4_ = 0x7f800000;
                auVar184 = vblendvps_avx(auVar136,local_440,auVar134);
                auVar114 = vshufps_avx(auVar184,auVar184,0xb1);
                auVar114 = vminps_avx(auVar184,auVar114);
                auVar131 = vshufpd_avx(auVar114,auVar114,5);
                auVar114 = vminps_avx(auVar114,auVar131);
                auVar131 = vpermpd_avx2(auVar114,0x4e);
                auVar114 = vminps_avx(auVar114,auVar131);
                auVar184 = vcmpps_avx(auVar184,auVar114,0);
                auVar114 = auVar134 & auVar184;
                if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar114 >> 0x7f,0) != '\0') ||
                      (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0xbf,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar114[0x1f] < '\0') {
                  auVar134 = vandps_avx(auVar184,auVar134);
                }
                uVar98 = vmovmskps_avx(auVar134);
                uVar100 = 0;
                for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                  uVar100 = uVar100 + 1;
                }
                uVar99 = (ulong)uVar100;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar104->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_7e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_7c0 = ZEXT1632(CONCAT88(auVar166._8_8_,pGVar104));
                  do {
                    local_684 = local_1e0[uVar99];
                    local_680 = *(undefined4 *)((long)&local_1c0 + uVar99 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar99 * 4);
                    local_730.context = context->user;
                    fVar141 = 1.0 - local_684;
                    auVar166 = ZEXT416((uint)(local_684 * fVar141 * 4.0));
                    auVar6 = vfnmsub213ss_fma(ZEXT416((uint)local_684),ZEXT416((uint)local_684),
                                              auVar166);
                    auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),
                                               auVar166);
                    fVar141 = fVar141 * -fVar141 * 0.5;
                    fVar140 = auVar6._0_4_ * 0.5;
                    fVar119 = auVar166._0_4_ * 0.5;
                    fVar120 = local_684 * local_684 * 0.5;
                    auVar169._0_4_ = fVar120 * (float)local_780._0_4_;
                    auVar169._4_4_ = fVar120 * (float)local_780._4_4_;
                    auVar169._8_4_ = fVar120 * (float)uStack_778;
                    auVar169._12_4_ = fVar120 * uStack_778._4_4_;
                    auVar149._4_4_ = fVar119;
                    auVar149._0_4_ = fVar119;
                    auVar149._8_4_ = fVar119;
                    auVar149._12_4_ = fVar119;
                    auVar166 = vfmadd132ps_fma(auVar149,auVar169,local_770);
                    auVar170._4_4_ = fVar140;
                    auVar170._0_4_ = fVar140;
                    auVar170._8_4_ = fVar140;
                    auVar170._12_4_ = fVar140;
                    auVar166 = vfmadd132ps_fma(auVar170,auVar166,local_760);
                    auVar150._4_4_ = fVar141;
                    auVar150._0_4_ = fVar141;
                    auVar150._8_4_ = fVar141;
                    auVar150._12_4_ = fVar141;
                    auVar166 = vfmadd132ps_fma(auVar150,auVar166,local_750);
                    local_690 = vmovlps_avx(auVar166);
                    local_688 = vextractps_avx(auVar166,2);
                    local_67c = (int)local_788;
                    local_678 = (int)local_7e8;
                    local_674 = (local_730.context)->instID[0];
                    local_670 = (local_730.context)->instPrimID[0];
                    local_7f4 = -1;
                    local_730.valid = &local_7f4;
                    local_730.geometryUserPtr = pGVar104->userPtr;
                    local_730.ray = (RTCRayN *)ray;
                    local_730.hit = (RTCHitN *)&local_690;
                    local_730.N = 1;
                    if (pGVar104->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018a6a05:
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar104->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        (*p_Var18)(&local_730);
                        ray = local_7f0;
                        pGVar104 = (Geometry *)local_7c0._0_8_;
                        if (*local_730.valid == 0) goto LAB_018a6aa1;
                      }
                      (((Vec3f *)((long)local_730.ray + 0x30))->field_0).components[0] =
                           *(float *)local_730.hit;
                      (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_730.hit + 4);
                      (((Vec3f *)((long)local_730.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_730.hit + 8);
                      *(float *)((long)local_730.ray + 0x3c) = *(float *)(local_730.hit + 0xc);
                      *(float *)((long)local_730.ray + 0x40) = *(float *)(local_730.hit + 0x10);
                      *(float *)((long)local_730.ray + 0x44) = *(float *)(local_730.hit + 0x14);
                      *(float *)((long)local_730.ray + 0x48) = *(float *)(local_730.hit + 0x18);
                      *(float *)((long)local_730.ray + 0x4c) = *(float *)(local_730.hit + 0x1c);
                      *(float *)((long)local_730.ray + 0x50) = *(float *)(local_730.hit + 0x20);
                    }
                    else {
                      auVar210 = ZEXT1664(auVar210._0_16_);
                      (*pGVar104->intersectionFilterN)(&local_730);
                      ray = local_7f0;
                      pGVar104 = (Geometry *)local_7c0._0_8_;
                      if (*local_730.valid != 0) goto LAB_018a6a05;
LAB_018a6aa1:
                      (local_7f0->super_RayK<1>).tfar = (float)local_7e0._0_4_;
                      ray = local_7f0;
                      pGVar104 = (Geometry *)local_7c0._0_8_;
                    }
                    *(undefined4 *)(local_580[0] + uVar99 * 4) = 0;
                    auVar114 = local_580[0];
                    fVar141 = (ray->super_RayK<1>).tfar;
                    auVar117._4_4_ = fVar141;
                    auVar117._0_4_ = fVar141;
                    auVar117._8_4_ = fVar141;
                    auVar117._12_4_ = fVar141;
                    auVar117._16_4_ = fVar141;
                    auVar117._20_4_ = fVar141;
                    auVar117._24_4_ = fVar141;
                    auVar117._28_4_ = fVar141;
                    auVar184 = vcmpps_avx(local_440,auVar117,2);
                    auVar134 = vandps_avx(auVar184,local_580[0]);
                    local_580[0] = auVar134;
                    auVar114 = auVar114 & auVar184;
                    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar114 >> 0x7f,0) == '\0') &&
                          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar114 >> 0xbf,0) == '\0') &&
                        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar114[0x1f]) goto LAB_018a6b3d;
                    auVar137._8_4_ = 0x7f800000;
                    auVar137._0_8_ = 0x7f8000007f800000;
                    auVar137._12_4_ = 0x7f800000;
                    auVar137._16_4_ = 0x7f800000;
                    auVar137._20_4_ = 0x7f800000;
                    auVar137._24_4_ = 0x7f800000;
                    auVar137._28_4_ = 0x7f800000;
                    auVar184 = vblendvps_avx(auVar137,local_440,auVar134);
                    auVar114 = vshufps_avx(auVar184,auVar184,0xb1);
                    auVar114 = vminps_avx(auVar184,auVar114);
                    auVar131 = vshufpd_avx(auVar114,auVar114,5);
                    auVar114 = vminps_avx(auVar114,auVar131);
                    auVar131 = vpermpd_avx2(auVar114,0x4e);
                    auVar114 = vminps_avx(auVar114,auVar131);
                    auVar184 = vcmpps_avx(auVar184,auVar114,0);
                    auVar114 = auVar134 & auVar184;
                    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar114 >> 0x7f,0) != '\0') ||
                          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar114 >> 0xbf,0) != '\0') ||
                        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar114[0x1f] < '\0') {
                      auVar134 = vandps_avx(auVar184,auVar134);
                    }
                    local_7e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    uVar98 = vmovmskps_avx(auVar134);
                    uVar100 = 0;
                    for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                      uVar100 = uVar100 + 1;
                    }
                    uVar99 = (ulong)uVar100;
                  } while( true );
                }
                fVar141 = local_1e0[uVar99];
                fVar140 = *(float *)((long)&local_1c0 + uVar99 * 4);
                fVar119 = 1.0 - fVar141;
                auVar166 = ZEXT416((uint)(fVar141 * fVar119 * 4.0));
                auVar6 = vfnmsub213ss_fma(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),auVar166);
                auVar166 = vfmadd213ss_fma(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),auVar166);
                fVar119 = fVar119 * -fVar119 * 0.5;
                fVar120 = auVar6._0_4_ * 0.5;
                fVar121 = auVar166._0_4_ * 0.5;
                fVar122 = fVar141 * fVar141 * 0.5;
                auVar167._0_4_ = fVar122 * (float)local_780._0_4_;
                auVar167._4_4_ = fVar122 * (float)local_780._4_4_;
                auVar167._8_4_ = fVar122 * (float)uStack_778;
                auVar167._12_4_ = fVar122 * uStack_778._4_4_;
                auVar147._4_4_ = fVar121;
                auVar147._0_4_ = fVar121;
                auVar147._8_4_ = fVar121;
                auVar147._12_4_ = fVar121;
                auVar166 = vfmadd132ps_fma(auVar147,auVar167,local_770);
                auVar168._4_4_ = fVar120;
                auVar168._0_4_ = fVar120;
                auVar168._8_4_ = fVar120;
                auVar168._12_4_ = fVar120;
                auVar166 = vfmadd132ps_fma(auVar168,auVar166,local_760);
                auVar148._4_4_ = fVar119;
                auVar148._0_4_ = fVar119;
                auVar148._8_4_ = fVar119;
                auVar148._12_4_ = fVar119;
                auVar166 = vfmadd132ps_fma(auVar148,auVar166,local_750);
                (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar99 * 4);
                uVar106 = vmovlps_avx(auVar166);
                *(undefined8 *)&(ray->Ng).field_0 = uVar106;
                fVar119 = (float)vextractps_avx(auVar166,2);
                (ray->Ng).field_0.field_0.z = fVar119;
                ray->u = fVar141;
                ray->v = fVar140;
                ray->primID = (uint)local_788;
                ray->geomID = (uint)local_7e8;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                prim = local_740;
              }
            }
          }
        }
        goto LAB_018a6812;
      }
LAB_018a5cf0:
      fVar141 = (ray->super_RayK<1>).tfar;
      auVar115._4_4_ = fVar141;
      auVar115._0_4_ = fVar141;
      auVar115._8_4_ = fVar141;
      auVar115._12_4_ = fVar141;
      auVar115._16_4_ = fVar141;
      auVar115._20_4_ = fVar141;
      auVar115._24_4_ = fVar141;
      auVar115._28_4_ = fVar141;
      auVar134 = vcmpps_avx(local_80,auVar115,2);
      uVar100 = vmovmskps_avx(auVar134);
      uVar96 = uVar96 & uVar96 + 0xff & uVar100;
    } while (uVar96 != 0);
  }
  return;
LAB_018a6b3d:
  auVar223 = ZEXT3264(local_620);
  auVar207 = ZEXT3264(local_6e0);
  prim = local_740;
LAB_018a6812:
  auVar139 = ZEXT3264(local_640);
  lVar101 = lVar101 + 8;
  auVar162 = ZEXT3264(local_5a0);
  if (iVar15 <= (int)lVar101) goto LAB_018a5cf0;
  goto LAB_018a5db4;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }